

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::InnerProduct_x86_avx512::forward
          (InnerProduct_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined4 uVar7;
  float fVar8;
  uint uVar9;
  _func_int *p_Var10;
  int *piVar11;
  long lVar12;
  void *pvVar13;
  float *pfVar14;
  bool bVar15;
  byte bVar16;
  ulong uVar17;
  ulong uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  byte bVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float afVar85 [16];
  float afVar86 [16];
  float afVar87 [16];
  float afVar88 [16];
  float afVar89 [16];
  float afVar90 [16];
  float afVar91 [16];
  float afVar92 [16];
  float afVar93 [16];
  float afVar94 [16];
  float afVar95 [16];
  float afVar96 [16];
  int iVar97;
  int iVar98;
  undefined1 (*pauVar99) [32];
  uint uVar100;
  ulong uVar101;
  ulong uVar102;
  undefined1 (*pauVar103) [32];
  void *pvVar104;
  long lVar105;
  int iVar106;
  uint uVar107;
  undefined1 (*pauVar108) [32];
  undefined1 (*pauVar109) [64];
  long lVar110;
  long lVar111;
  long lVar112;
  long lVar113;
  uint uVar114;
  long lVar115;
  long lVar116;
  long lVar117;
  uint uVar118;
  ushort uVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [28];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  float fVar189;
  float fVar190;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  v4sf one_4;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar213 [32];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar214 [64];
  float fVar215;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar222 [16];
  undefined1 auVar226 [32];
  undefined1 auVar225 [16];
  undefined1 auVar227 [64];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  v4sf one;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar235 [16];
  undefined1 auVar238 [64];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [64];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [64];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [64];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [64];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [32];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [32];
  undefined1 auVar260 [16];
  undefined1 auVar261 [32];
  undefined1 auVar263 [16];
  undefined1 auVar262 [16];
  undefined1 auVar264 [64];
  undefined1 in_ZMM16 [64];
  undefined1 auVar265 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar266 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar267 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar268 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar269 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM29 [64];
  undefined1 in_ZMM30 [64];
  Option opt_flatten;
  undefined4 in_stack_fffffffffffffe8c;
  uint local_170;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  undefined1 (*local_f8) [32];
  int *piStack_f0;
  size_t local_e8;
  int local_e0;
  Allocator *local_d8;
  int local_d0;
  int local_cc;
  undefined8 local_c8;
  int local_c0;
  size_t local_b8;
  _func_int *local_a8;
  long local_a0;
  long local_98;
  long local_90;
  ulong local_88;
  ulong local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [48];
  
  auVar121 = in_ZMM30._0_16_;
  auVar120 = in_ZMM29._0_16_;
  if ((opt->use_int8_inference == true) &&
     (*(int *)(&this->field_0xdc + (long)this->_vptr_InnerProduct_x86_avx512[-3]) != 0)) {
    iVar97 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar97;
  }
  iVar97 = cpu_support_x86_f16c();
  if ((iVar97 != 0) && (opt->use_fp16_storage == true)) {
    iVar97 = forward_fp16s(this,bottom_blob,top_blob,opt);
    return iVar97;
  }
  local_d0 = bottom_blob->dims;
  if (local_d0 == 2) {
    local_cc = bottom_blob->w;
    if (local_cc ==
        *(int *)(&this->field_0xd8 + (long)this->_vptr_InnerProduct_x86_avx512[-3]) /
        *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx512[-3])) {
      Mat::create(top_blob,*(int *)(&this->field_0xd0 +
                                   (long)this->_vptr_InnerProduct_x86_avx512[-3]),bottom_blob->h,
                  bottom_blob->elemsize,bottom_blob->elempack,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      p_Var10 = this->_vptr_InnerProduct_x86_avx512[-3];
      innerproduct_gemm_sse
                (bottom_blob,top_blob,&this->weight_data_tm,
                 *(Mat **)(&this->field_0x178 + (long)p_Var10),
                 *(int *)(&this->field_0xe0 + (long)p_Var10),
                 (Mat *)(&this->field_0xe8 + (long)p_Var10),
                 (Option *)CONCAT44(in_stack_fffffffffffffe8c,(uint)opt->use_packing_layout));
      return 0;
    }
  }
  else {
    local_cc = bottom_blob->w;
  }
  piVar11 = bottom_blob->refcount;
  local_f8 = (undefined1 (*) [32])bottom_blob->data;
  piStack_f0 = bottom_blob->refcount;
  local_e8 = bottom_blob->elemsize;
  local_e0 = bottom_blob->elempack;
  local_d8 = bottom_blob->allocator;
  local_c8._0_4_ = bottom_blob->h;
  local_c8._4_4_ = bottom_blob->d;
  local_c0 = bottom_blob->c;
  local_b8 = bottom_blob->cstep;
  iVar97 = local_d0;
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + 1;
    UNLOCK();
    iVar97 = bottom_blob->dims;
  }
  if (iVar97 != 1) {
    auStack_68 = SUB6448(*opt,0x10);
    local_78 = SUB648(*opt,0);
    pAStack_70 = opt->workspace_allocator;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_f8);
  }
  uVar9 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx512[-3]);
  uVar100 = 1;
  if (opt->use_packing_layout == true) {
    if ((uVar9 & 0xf) == 0) {
      uVar100 = 0x10;
    }
    else if ((uVar9 & 7) == 0) {
      uVar100 = 8;
    }
    else {
      uVar100 = (uint)((uVar9 & 3) == 0) * 3 + 1;
    }
  }
  Mat::create(top_blob,(int)uVar9 / (int)uVar100,(ulong)uVar100 * (local_e8 / (ulong)(long)local_e0)
              ,uVar100,opt->blob_allocator);
  pauVar108 = local_f8;
  afVar96 = _ps512_cephes_log_q2;
  afVar95 = _ps512_cephes_log_q1;
  afVar94 = _ps512_cephes_exp_p5;
  afVar93 = _ps512_cephes_exp_p4;
  afVar92 = _ps512_cephes_exp_p3;
  afVar91 = _ps512_cephes_exp_p2;
  afVar90 = _ps512_cephes_exp_p1;
  afVar89 = _ps512_cephes_exp_p0;
  afVar88 = _ps512_cephes_LOG2EF;
  afVar87 = _ps512_exp_lo;
  afVar86 = _ps512_exp_hi;
  afVar85 = _ps512_1;
  iVar97 = -100;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_002a523f;
  p_Var10 = this->_vptr_InnerProduct_x86_avx512[-3];
  uVar9 = *(uint *)(&this->field_0xe0 + (long)p_Var10);
  lVar12 = *(long *)(&this->field_0x178 + (long)p_Var10);
  uVar118 = local_e0 * local_cc;
  iVar106 = top_blob->elempack;
  uVar100 = top_blob->w;
  uVar102 = (ulong)uVar100;
  iVar98 = 0;
  iVar97 = iVar98;
  if (iVar106 < 8) {
    if (iVar106 == 1) {
      lVar112 = (long)(int)uVar118;
      if (0 < (int)uVar100 >> 3) {
        local_88 = (ulong)(uint)((int)uVar100 >> 3);
        lVar110 = lVar112 * 0x1c;
        local_90 = lVar112 * 0x20;
        lVar113 = lVar112 * 8;
        lVar111 = lVar112 * 0x18;
        local_100 = lVar112 * 4;
        lVar115 = lVar112 * 0x14;
        local_108 = lVar112 << 4;
        local_110 = lVar112 * 0xc;
        local_118 = 0;
        auVar147 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar148 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar221._8_4_ = 0x3f000000;
        auVar221._0_8_ = 0x3f0000003f000000;
        auVar221._12_4_ = 0x3f000000;
        auVar221._16_4_ = 0x3f000000;
        auVar221._20_4_ = 0x3f000000;
        auVar221._24_4_ = 0x3f000000;
        auVar221._28_4_ = 0x3f000000;
        auVar149 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar231._8_4_ = 0x3f800000;
        auVar231._0_8_ = 0x3f8000003f800000;
        auVar231._12_4_ = 0x3f800000;
        auVar231._16_4_ = 0x3f800000;
        auVar231._20_4_ = 0x3f800000;
        auVar231._24_4_ = 0x3f800000;
        auVar231._28_4_ = 0x3f800000;
        auVar234._8_4_ = 0x3f318000;
        auVar234._0_8_ = 0x3f3180003f318000;
        auVar234._12_4_ = 0x3f318000;
        auVar234._16_4_ = 0x3f318000;
        auVar234._20_4_ = 0x3f318000;
        auVar234._24_4_ = 0x3f318000;
        auVar234._28_4_ = 0x3f318000;
        auVar241._8_4_ = 0x39506967;
        auVar241._0_8_ = 0x3950696739506967;
        auVar241._12_4_ = 0x39506967;
        auVar241._16_4_ = 0x39506967;
        auVar241._20_4_ = 0x39506967;
        auVar241._24_4_ = 0x39506967;
        auVar241._28_4_ = 0x39506967;
        auVar150 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar151 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar152 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar255._8_4_ = 0x3e2aaaaa;
        auVar255._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar255._12_4_ = 0x3e2aaaaa;
        auVar255._16_4_ = 0x3e2aaaaa;
        auVar255._20_4_ = 0x3e2aaaaa;
        auVar255._24_4_ = 0x3e2aaaaa;
        auVar255._28_4_ = 0x3e2aaaaa;
        auVar259._8_4_ = 0x3f800000;
        auVar259._0_8_ = 0x3f8000003f800000;
        auVar259._12_4_ = 0x3f800000;
        auVar259._16_4_ = 0x3f800000;
        auVar259._20_4_ = 0x3f800000;
        auVar259._24_4_ = 0x3f800000;
        auVar259._28_4_ = 0x3f800000;
        auVar261._8_4_ = 0xb95e8083;
        auVar261._0_8_ = 0xb95e8083b95e8083;
        auVar261._12_4_ = 0xb95e8083;
        auVar261._16_4_ = 0xb95e8083;
        auVar261._20_4_ = 0xb95e8083;
        auVar261._24_4_ = 0xb95e8083;
        auVar261._28_4_ = 0xb95e8083;
        auVar153 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar154 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar155 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar156 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar157 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar158 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar120 = vxorps_avx512vl(auVar121,auVar121);
        auVar159 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        uVar102 = 0;
        do {
          uVar101 = uVar102 * 8;
          auVar243 = ZEXT1664(ZEXT816(0) << 0x40);
          if (lVar12 != 0) {
            auVar243 = ZEXT3264(*(undefined1 (*) [32])(lVar12 + uVar102 * 0x20));
          }
          auVar168 = auVar243._0_32_;
          pvVar104 = (this->weight_data_tm).data;
          if ((int)uVar118 < 8) {
            uVar114 = 0;
            lVar116 = uVar101 * lVar112 * 4;
            lVar117 = (uVar101 | 1) * lVar112 * 4;
            lVar1 = (uVar101 | 2) * lVar112 * 4;
            lVar2 = (uVar101 | 3) * lVar112 * 4;
            lVar3 = (uVar101 | 4) * lVar112 * 4;
            lVar4 = (uVar101 | 5) * lVar112 * 4;
            lVar5 = (uVar101 | 6) * lVar112 * 4;
            lVar6 = (uVar101 | 7) * lVar112 * 4;
            auVar167 = SUB6432(ZEXT864(0),0);
            auVar166 = ZEXT832(0);
            auVar165 = ZEXT832(0);
            auVar164 = SUB6432(ZEXT864(0),0);
            auVar163 = ZEXT832(0);
            auVar162 = SUB6432(ZEXT864(0),0);
            auVar161 = ZEXT832(0);
            auVar160 = SUB6432(ZEXT864(0),0);
            pauVar99 = local_f8;
            local_a0 = lVar113;
            local_98 = lVar110;
          }
          else {
            auVar264 = ZEXT864(0);
            iVar97 = 7;
            auVar252 = ZEXT864(0);
            auVar249 = ZEXT864(0);
            auVar227 = ZEXT864(0);
            auVar246 = ZEXT864(0);
            auVar214 = ZEXT864(0);
            auVar265 = ZEXT864(0);
            auVar238 = ZEXT864(0);
            lVar116 = 0;
            do {
              lVar105 = lVar116;
              auVar167 = *(undefined1 (*) [32])(*local_f8 + lVar105);
              auVar160 = vfmadd231ps_avx512vl
                                   (auVar264._0_32_,auVar167,
                                    *(undefined1 (*) [32])((long)pvVar104 + lVar105 + local_118));
              auVar264 = ZEXT3264(auVar160);
              auVar161 = vfmadd231ps_avx512vl
                                   (auVar252._0_32_,auVar167,
                                    *(undefined1 (*) [32])((long)pvVar104 + lVar105 + local_100));
              auVar252 = ZEXT3264(auVar161);
              auVar162 = vfmadd231ps_avx512vl
                                   (auVar249._0_32_,auVar167,
                                    *(undefined1 (*) [32])((long)pvVar104 + lVar105 + lVar113));
              auVar249 = ZEXT3264(auVar162);
              auVar163 = vfmadd231ps_avx512vl
                                   (auVar227._0_32_,auVar167,
                                    *(undefined1 (*) [32])((long)pvVar104 + lVar105 + local_110));
              auVar227 = ZEXT3264(auVar163);
              auVar164 = vfmadd231ps_avx512vl
                                   (auVar246._0_32_,auVar167,
                                    *(undefined1 (*) [32])((long)pvVar104 + lVar105 + local_108));
              auVar246 = ZEXT3264(auVar164);
              auVar165 = vfmadd231ps_avx512vl
                                   (auVar214._0_32_,auVar167,
                                    *(undefined1 (*) [32])((long)pvVar104 + lVar105 + lVar115));
              auVar214 = ZEXT3264(auVar165);
              auVar166 = vfmadd231ps_avx512vl
                                   (auVar265._0_32_,auVar167,
                                    *(undefined1 (*) [32])((long)pvVar104 + lVar105 + lVar111));
              auVar265 = ZEXT3264(auVar166);
              auVar167 = vfmadd231ps_avx512vl
                                   (auVar238._0_32_,auVar167,
                                    *(undefined1 (*) [32])((long)pvVar104 + lVar105 + lVar110));
              auVar238 = ZEXT3264(auVar167);
              iVar97 = iVar97 + 8;
              lVar116 = lVar105 + 0x20;
            } while (iVar97 < (int)uVar118);
            lVar6 = lVar116 + lVar110;
            lVar5 = lVar116 + lVar111;
            lVar4 = lVar116 + lVar115;
            lVar3 = lVar116 + local_108;
            lVar2 = lVar116 + local_110;
            lVar1 = lVar116 + lVar113;
            lVar117 = lVar116 + local_100;
            lVar116 = lVar116 + local_118;
            pauVar99 = (undefined1 (*) [32])(local_f8[1] + lVar105);
            uVar114 = uVar118 & 0xfffffff8;
          }
          if (uVar118 - uVar114 != 0 && (int)uVar114 <= (int)uVar118) {
            lVar105 = 0;
            do {
              auVar121 = vinsertps_avx512f(ZEXT416(*(uint *)((long)pvVar104 + lVar105 * 4 + lVar3)),
                                           ZEXT416(*(uint *)((long)pvVar104 + lVar105 * 4 + lVar4)),
                                           0x10);
              auVar121 = vinsertps_avx512f(auVar121,ZEXT416(*(uint *)((long)pvVar104 +
                                                                     lVar105 * 4 + lVar5)),0x20);
              auVar121 = vinsertps_avx512f(auVar121,ZEXT416(*(uint *)((long)pvVar104 +
                                                                     lVar105 * 4 + lVar6)),0x30);
              auVar122 = vinsertps_avx512f(ZEXT416(*(uint *)((long)pvVar104 + lVar105 * 4 + lVar116)
                                                  ),ZEXT416(*(uint *)((long)pvVar104 +
                                                                     lVar105 * 4 + lVar117)),0x10);
              auVar122 = vinsertps_avx512f(auVar122,ZEXT416(*(uint *)((long)pvVar104 +
                                                                     lVar105 * 4 + lVar1)),0x20);
              auVar122 = vinsertps_avx512f(auVar122,ZEXT416(*(uint *)((long)pvVar104 +
                                                                     lVar105 * 4 + lVar2)),0x30);
              auVar168 = vinsertf32x4_avx512vl(ZEXT1632(auVar122),auVar121,1);
              uVar7 = *(undefined4 *)(*pauVar99 + lVar105 * 4);
              auVar54._4_4_ = uVar7;
              auVar54._0_4_ = uVar7;
              auVar54._8_4_ = uVar7;
              auVar54._12_4_ = uVar7;
              auVar54._16_4_ = uVar7;
              auVar54._20_4_ = uVar7;
              auVar54._24_4_ = uVar7;
              auVar54._28_4_ = uVar7;
              auVar168 = vfmadd231ps_avx512vl(auVar243._0_32_,auVar168,auVar54);
              auVar243 = ZEXT3264(auVar168);
              lVar105 = lVar105 + 1;
            } while (uVar118 - uVar114 != (int)lVar105);
          }
          auVar160 = vhaddps_avx(auVar160,auVar161);
          auVar161 = vhaddps_avx(auVar162,auVar163);
          auVar161 = vhaddps_avx(auVar160,auVar161);
          auVar160 = vhaddps_avx(auVar164,auVar165);
          auVar162 = vhaddps_avx(auVar166,auVar167);
          auVar162 = vhaddps_avx(auVar160,auVar162);
          auVar160 = vblendps_avx(auVar161,auVar162,0xf0);
          auVar161 = vperm2f128_avx(auVar161,auVar162,0x21);
          auVar174._0_4_ = auVar161._0_4_ + auVar160._0_4_ + auVar168._0_4_;
          auVar174._4_4_ = auVar161._4_4_ + auVar160._4_4_ + auVar168._4_4_;
          auVar174._8_4_ = auVar161._8_4_ + auVar160._8_4_ + auVar168._8_4_;
          auVar174._12_4_ = auVar161._12_4_ + auVar160._12_4_ + auVar168._12_4_;
          auVar174._16_4_ = auVar161._16_4_ + auVar160._16_4_ + auVar168._16_4_;
          auVar174._20_4_ = auVar161._20_4_ + auVar160._20_4_ + auVar168._20_4_;
          auVar174._24_4_ = auVar161._24_4_ + auVar160._24_4_ + auVar168._24_4_;
          auVar174._28_4_ = auVar161._28_4_ + auVar160._28_4_ + auVar168._28_4_;
          if (uVar9 - 1 < 6) {
            auVar168 = ZEXT1632(auVar120);
            switch(uVar9) {
            case 1:
              auVar174 = vmaxps_avx512vl(auVar174,ZEXT1632(auVar120));
              break;
            case 2:
              auVar160 = vmaxps_avx512vl(auVar174,auVar168);
              auVar168 = vminps_avx512vl(auVar174,auVar168);
              uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var10);
              auVar68._4_4_ = uVar7;
              auVar68._0_4_ = uVar7;
              auVar68._8_4_ = uVar7;
              auVar68._12_4_ = uVar7;
              auVar68._16_4_ = uVar7;
              auVar68._20_4_ = uVar7;
              auVar68._24_4_ = uVar7;
              auVar68._28_4_ = uVar7;
              auVar174 = vfmadd132ps_avx512vl(auVar168,auVar160,auVar68);
              break;
            case 3:
              uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var10);
              auVar66._4_4_ = uVar7;
              auVar66._0_4_ = uVar7;
              auVar66._8_4_ = uVar7;
              auVar66._12_4_ = uVar7;
              auVar66._16_4_ = uVar7;
              auVar66._20_4_ = uVar7;
              auVar66._24_4_ = uVar7;
              auVar66._28_4_ = uVar7;
              auVar168 = vmaxps_avx512vl(auVar174,auVar66);
              uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var10))[1];
              auVar67._4_4_ = uVar7;
              auVar67._0_4_ = uVar7;
              auVar67._8_4_ = uVar7;
              auVar67._12_4_ = uVar7;
              auVar67._16_4_ = uVar7;
              auVar67._20_4_ = uVar7;
              auVar67._24_4_ = uVar7;
              auVar67._28_4_ = uVar7;
              auVar174 = vminps_avx512vl(auVar168,auVar67);
              break;
            case 4:
              auVar64._8_4_ = 0x80000000;
              auVar64._0_8_ = 0x8000000080000000;
              auVar64._12_4_ = 0x80000000;
              auVar64._16_4_ = 0x80000000;
              auVar64._20_4_ = 0x80000000;
              auVar64._24_4_ = 0x80000000;
              auVar64._28_4_ = 0x80000000;
              auVar168 = vxorps_avx512vl(auVar174,auVar64);
              auVar168 = vminps_avx512vl(auVar168,auVar147);
              auVar160 = vmaxps_avx512vl(auVar168,auVar148);
              auVar161 = vfmadd231ps_avx512vl(auVar221,auVar160,auVar149);
              auVar168 = vroundps_avx(auVar161,1);
              uVar101 = vcmpps_avx512vl(auVar161,auVar168,1);
              auVar162 = vsubps_avx512vl(auVar168,auVar231);
              bVar15 = (bool)((byte)uVar101 & 1);
              auVar175._0_4_ =
                   (float)((uint)bVar15 * auVar162._0_4_ | (uint)!bVar15 * auVar168._0_4_);
              bVar15 = (bool)((byte)(uVar101 >> 1) & 1);
              auVar175._4_4_ =
                   (float)((uint)bVar15 * auVar162._4_4_ | (uint)!bVar15 * auVar168._4_4_);
              bVar15 = (bool)((byte)(uVar101 >> 2) & 1);
              auVar175._8_4_ =
                   (float)((uint)bVar15 * auVar162._8_4_ | (uint)!bVar15 * auVar168._8_4_);
              bVar15 = (bool)((byte)(uVar101 >> 3) & 1);
              auVar175._12_4_ =
                   (float)((uint)bVar15 * auVar162._12_4_ | (uint)!bVar15 * auVar168._12_4_);
              bVar15 = (bool)((byte)(uVar101 >> 4) & 1);
              auVar175._16_4_ =
                   (float)((uint)bVar15 * auVar162._16_4_ | (uint)!bVar15 * auVar168._16_4_);
              bVar15 = (bool)((byte)(uVar101 >> 5) & 1);
              auVar175._20_4_ =
                   (float)((uint)bVar15 * auVar162._20_4_ | (uint)!bVar15 * auVar168._20_4_);
              bVar15 = (bool)((byte)(uVar101 >> 6) & 1);
              auVar175._24_4_ =
                   (float)((uint)bVar15 * auVar162._24_4_ | (uint)!bVar15 * auVar168._24_4_);
              bVar15 = SUB81(uVar101 >> 7,0);
              auVar175._28_4_ =
                   (float)((uint)bVar15 * auVar162._28_4_ | (uint)!bVar15 * auVar168._28_4_);
              auVar121 = vfmsub231ps_fma(auVar160,auVar175,auVar234);
              auVar65._8_4_ = 0x395e8083;
              auVar65._0_8_ = 0x395e8083395e8083;
              auVar65._12_4_ = 0x395e8083;
              auVar65._16_4_ = 0x395e8083;
              auVar65._20_4_ = 0x395e8083;
              auVar65._24_4_ = 0x395e8083;
              auVar65._28_4_ = 0x395e8083;
              auVar168 = vfmsub231ps_avx512vl(ZEXT1632(auVar121),auVar175,auVar65);
              auVar81._4_4_ = auVar168._4_4_ * auVar168._4_4_;
              auVar81._0_4_ = auVar168._0_4_ * auVar168._0_4_;
              auVar81._8_4_ = auVar168._8_4_ * auVar168._8_4_;
              auVar81._12_4_ = auVar168._12_4_ * auVar168._12_4_;
              auVar81._16_4_ = auVar168._16_4_ * auVar168._16_4_;
              auVar81._20_4_ = auVar168._20_4_ * auVar168._20_4_;
              auVar81._24_4_ = auVar168._24_4_ * auVar168._24_4_;
              auVar81._28_4_ = auVar161._28_4_;
              auVar160 = vfmadd213ps_avx512vl(auVar241,auVar168,auVar150);
              auVar160 = vfmadd213ps_avx512vl(auVar160,auVar168,auVar151);
              auVar160 = vfmadd213ps_avx512vl(auVar160,auVar168,auVar152);
              auVar121 = vfmadd213ps_fma(auVar160,auVar168,auVar255);
              auVar121 = vfmadd213ps_fma(ZEXT1632(auVar121),auVar168,auVar221);
              auVar121 = vfmadd213ps_fma(ZEXT1632(auVar121),auVar81,auVar168);
              auVar202._0_4_ = auVar121._0_4_ + 1.0;
              auVar202._4_4_ = auVar121._4_4_ + 1.0;
              auVar202._8_4_ = auVar121._8_4_ + 1.0;
              auVar202._12_4_ = auVar121._12_4_ + 1.0;
              auVar202._16_4_ = 0x3f800000;
              auVar202._20_4_ = 0x3f800000;
              auVar202._24_4_ = 0x3f800000;
              auVar202._28_4_ = 0x3f800000;
              auVar194._0_4_ = (int)auVar175._0_4_;
              auVar194._4_4_ = (int)auVar175._4_4_;
              auVar194._8_4_ = (int)auVar175._8_4_;
              auVar194._12_4_ = (int)auVar175._12_4_;
              auVar194._16_4_ = (int)auVar175._16_4_;
              auVar194._20_4_ = (int)auVar175._20_4_;
              auVar194._24_4_ = (int)auVar175._24_4_;
              auVar194._28_4_ = (int)auVar175._28_4_;
              auVar168 = vpslld_avx2(auVar194,0x17);
              auVar168 = vpaddd_avx2(auVar259,auVar168);
              auVar121 = vfmadd213ps_fma(auVar168,auVar202,auVar231);
              auVar168 = vrcpps_avx(ZEXT1632(auVar121));
              auVar121 = vfmsub213ps_fma(ZEXT1632(auVar121),auVar168,auVar231);
              auVar121 = vfnmadd132ps_fma(ZEXT1632(auVar121),auVar168,auVar168);
              auVar174 = ZEXT1632(auVar121);
              break;
            case 5:
              auVar160 = vminps_avx512vl(auVar174,auVar147);
              auVar161 = vmaxps_avx512vl(auVar160,auVar148);
              auVar121 = vfmadd213ps_fma(auVar149,auVar161,auVar221);
              auVar160 = vroundps_avx(ZEXT1632(auVar121),1);
              uVar101 = vcmpps_avx512vl(ZEXT1632(auVar121),auVar160,1);
              auVar162 = vsubps_avx512vl(auVar160,auVar231);
              bVar15 = (bool)((byte)uVar101 & 1);
              auVar169._0_4_ =
                   (float)((uint)bVar15 * auVar162._0_4_ | (uint)!bVar15 * auVar160._0_4_);
              bVar15 = (bool)((byte)(uVar101 >> 1) & 1);
              auVar169._4_4_ =
                   (float)((uint)bVar15 * auVar162._4_4_ | (uint)!bVar15 * auVar160._4_4_);
              bVar15 = (bool)((byte)(uVar101 >> 2) & 1);
              auVar169._8_4_ =
                   (float)((uint)bVar15 * auVar162._8_4_ | (uint)!bVar15 * auVar160._8_4_);
              bVar15 = (bool)((byte)(uVar101 >> 3) & 1);
              auVar169._12_4_ =
                   (float)((uint)bVar15 * auVar162._12_4_ | (uint)!bVar15 * auVar160._12_4_);
              bVar15 = (bool)((byte)(uVar101 >> 4) & 1);
              auVar169._16_4_ =
                   (float)((uint)bVar15 * auVar162._16_4_ | (uint)!bVar15 * auVar160._16_4_);
              bVar15 = (bool)((byte)(uVar101 >> 5) & 1);
              auVar169._20_4_ =
                   (float)((uint)bVar15 * auVar162._20_4_ | (uint)!bVar15 * auVar160._20_4_);
              bVar15 = (bool)((byte)(uVar101 >> 6) & 1);
              auVar169._24_4_ =
                   (float)((uint)bVar15 * auVar162._24_4_ | (uint)!bVar15 * auVar160._24_4_);
              bVar15 = SUB81(uVar101 >> 7,0);
              auVar169._28_4_ =
                   (float)((uint)bVar15 * auVar162._28_4_ | (uint)!bVar15 * auVar160._28_4_);
              auVar121 = vfmsub231ps_fma(auVar161,auVar169,auVar234);
              auVar122 = vfnmsub231ps_fma(ZEXT1632(auVar121),auVar169,auVar261);
              auVar161 = ZEXT1632(auVar122);
              auVar160 = vfmadd213ps_avx512vl(auVar241,auVar161,auVar150);
              auVar160 = vfmadd213ps_avx512vl(auVar160,auVar161,auVar151);
              auVar160 = vfmadd213ps_avx512vl(auVar160,auVar161,auVar152);
              auVar161 = ZEXT1632(auVar122);
              auVar121 = vfmadd213ps_fma(auVar160,auVar161,auVar255);
              auVar121 = vfmadd213ps_fma(ZEXT1632(auVar121),auVar161,auVar221);
              auVar121 = vfmadd213ps_fma(ZEXT1632(auVar121),
                                         ZEXT1632(CONCAT412(auVar122._12_4_ * auVar122._12_4_,
                                                            CONCAT48(auVar122._8_4_ * auVar122._8_4_
                                                                     ,CONCAT44(auVar122._4_4_ *
                                                                               auVar122._4_4_,
                                                                               auVar122._0_4_ *
                                                                               auVar122._0_4_)))),
                                         auVar161);
              auVar200._0_4_ = auVar121._0_4_ + 1.0;
              auVar200._4_4_ = auVar121._4_4_ + 1.0;
              auVar200._8_4_ = auVar121._8_4_ + 1.0;
              auVar200._12_4_ = auVar121._12_4_ + 1.0;
              auVar200._16_4_ = 0x3f800000;
              auVar200._20_4_ = 0x3f800000;
              auVar200._24_4_ = 0x3f800000;
              auVar200._28_4_ = 0x3f800000;
              auVar211._0_4_ = (int)auVar169._0_4_;
              auVar211._4_4_ = (int)auVar169._4_4_;
              auVar211._8_4_ = (int)auVar169._8_4_;
              auVar211._12_4_ = (int)auVar169._12_4_;
              auVar211._16_4_ = (int)auVar169._16_4_;
              auVar211._20_4_ = (int)auVar169._20_4_;
              auVar211._24_4_ = (int)auVar169._24_4_;
              auVar211._28_4_ = (int)auVar169._28_4_;
              auVar160 = vpslld_avx2(auVar211,0x17);
              auVar160 = vpaddd_avx2(auVar259,auVar160);
              auVar121 = vfmadd213ps_fma(auVar160,auVar200,auVar231);
              uVar101 = vcmpps_avx512vl(ZEXT1632(auVar121),auVar168,2);
              auVar56._8_4_ = 0x800000;
              auVar56._0_8_ = 0x80000000800000;
              auVar56._12_4_ = 0x800000;
              auVar56._16_4_ = 0x800000;
              auVar56._20_4_ = 0x800000;
              auVar56._24_4_ = 0x800000;
              auVar56._28_4_ = 0x800000;
              auVar168 = vmaxps_avx512vl(ZEXT1632(auVar121),auVar56);
              auVar162 = vpsrld_avx2(auVar168,0x17);
              auVar226._8_4_ = 0x807fffff;
              auVar226._0_8_ = 0x807fffff807fffff;
              auVar226._12_4_ = 0x807fffff;
              auVar226._16_4_ = 0x807fffff;
              auVar226._20_4_ = 0x807fffff;
              auVar226._24_4_ = 0x807fffff;
              auVar226._28_4_ = 0x807fffff;
              auVar57._8_4_ = 0x3f000000;
              auVar57._0_8_ = 0x3f0000003f000000;
              auVar57._12_4_ = 0x3f000000;
              auVar57._16_4_ = 0x3f000000;
              auVar57._20_4_ = 0x3f000000;
              auVar57._24_4_ = 0x3f000000;
              auVar57._28_4_ = 0x3f000000;
              auVar168 = vpternlogd_avx512vl(auVar168,auVar226,auVar57,0xea);
              auVar58._8_4_ = 0x3f3504f3;
              auVar58._0_8_ = 0x3f3504f33f3504f3;
              auVar58._12_4_ = 0x3f3504f3;
              auVar58._16_4_ = 0x3f3504f3;
              auVar58._20_4_ = 0x3f3504f3;
              auVar58._24_4_ = 0x3f3504f3;
              auVar58._28_4_ = 0x3f3504f3;
              uVar17 = vcmpps_avx512vl(auVar168,auVar58,1);
              auVar160 = vaddps_avx512vl(auVar168,auVar153);
              auVar161 = vaddps_avx512vl(auVar160,auVar168);
              bVar15 = (bool)((byte)uVar17 & 1);
              auVar170._0_4_ =
                   (float)((uint)bVar15 * auVar161._0_4_ | (uint)!bVar15 * auVar160._0_4_);
              bVar15 = (bool)((byte)(uVar17 >> 1) & 1);
              auVar170._4_4_ =
                   (float)((uint)bVar15 * auVar161._4_4_ | (uint)!bVar15 * auVar160._4_4_);
              bVar15 = (bool)((byte)(uVar17 >> 2) & 1);
              auVar170._8_4_ =
                   (float)((uint)bVar15 * auVar161._8_4_ | (uint)!bVar15 * auVar160._8_4_);
              bVar15 = (bool)((byte)(uVar17 >> 3) & 1);
              auVar170._12_4_ =
                   (float)((uint)bVar15 * auVar161._12_4_ | (uint)!bVar15 * auVar160._12_4_);
              bVar15 = (bool)((byte)(uVar17 >> 4) & 1);
              auVar170._16_4_ =
                   (float)((uint)bVar15 * auVar161._16_4_ | (uint)!bVar15 * auVar160._16_4_);
              bVar15 = (bool)((byte)(uVar17 >> 5) & 1);
              auVar170._20_4_ =
                   (float)((uint)bVar15 * auVar161._20_4_ | (uint)!bVar15 * auVar160._20_4_);
              bVar15 = (bool)((byte)(uVar17 >> 6) & 1);
              auVar170._24_4_ =
                   (float)((uint)bVar15 * auVar161._24_4_ | (uint)!bVar15 * auVar160._24_4_);
              bVar15 = SUB81(uVar17 >> 7,0);
              auVar170._28_4_ = (uint)bVar15 * auVar161._28_4_ | (uint)!bVar15 * auVar160._28_4_;
              auVar79._4_4_ = auVar170._4_4_ * auVar170._4_4_;
              auVar79._0_4_ = auVar170._0_4_ * auVar170._0_4_;
              auVar79._8_4_ = auVar170._8_4_ * auVar170._8_4_;
              auVar79._12_4_ = auVar170._12_4_ * auVar170._12_4_;
              auVar79._16_4_ = auVar170._16_4_ * auVar170._16_4_;
              auVar79._20_4_ = auVar170._20_4_ * auVar170._20_4_;
              auVar79._24_4_ = auVar170._24_4_ * auVar170._24_4_;
              auVar79._28_4_ = auVar168._28_4_;
              auVar59._8_4_ = 0xbdebd1b8;
              auVar59._0_8_ = 0xbdebd1b8bdebd1b8;
              auVar59._12_4_ = 0xbdebd1b8;
              auVar59._16_4_ = 0xbdebd1b8;
              auVar59._20_4_ = 0xbdebd1b8;
              auVar59._24_4_ = 0xbdebd1b8;
              auVar59._28_4_ = 0xbdebd1b8;
              auVar168 = vfmadd213ps_avx512vl(auVar154,auVar170,auVar59);
              auVar60._8_4_ = 0x3def251a;
              auVar60._0_8_ = 0x3def251a3def251a;
              auVar60._12_4_ = 0x3def251a;
              auVar60._16_4_ = 0x3def251a;
              auVar60._20_4_ = 0x3def251a;
              auVar60._24_4_ = 0x3def251a;
              auVar60._28_4_ = 0x3def251a;
              auVar168 = vfmadd213ps_avx512vl(auVar168,auVar170,auVar60);
              auVar61._8_4_ = 0xbdfe5d4f;
              auVar61._0_8_ = 0xbdfe5d4fbdfe5d4f;
              auVar61._12_4_ = 0xbdfe5d4f;
              auVar61._16_4_ = 0xbdfe5d4f;
              auVar61._20_4_ = 0xbdfe5d4f;
              auVar61._24_4_ = 0xbdfe5d4f;
              auVar61._28_4_ = 0xbdfe5d4f;
              auVar168 = vfmadd213ps_avx512vl(auVar168,auVar170,auVar61);
              auVar62._8_4_ = 0x3e11e9bf;
              auVar62._0_8_ = 0x3e11e9bf3e11e9bf;
              auVar62._12_4_ = 0x3e11e9bf;
              auVar62._16_4_ = 0x3e11e9bf;
              auVar62._20_4_ = 0x3e11e9bf;
              auVar62._24_4_ = 0x3e11e9bf;
              auVar62._28_4_ = 0x3e11e9bf;
              auVar168 = vfmadd213ps_avx512vl(auVar168,auVar170,auVar62);
              auVar168 = vfmadd213ps_avx512vl(auVar168,auVar170,auVar155);
              auVar168 = vfmadd213ps_avx512vl(auVar168,auVar170,auVar156);
              auVar168 = vfmadd213ps_avx512vl(auVar168,auVar170,auVar157);
              auVar168 = vfmadd213ps_avx512vl(auVar168,auVar170,auVar158);
              auVar80._4_4_ = auVar170._4_4_ * auVar170._4_4_ * auVar170._4_4_ * auVar168._4_4_;
              auVar80._0_4_ = auVar170._0_4_ * auVar170._0_4_ * auVar170._0_4_ * auVar168._0_4_;
              auVar80._8_4_ = auVar170._8_4_ * auVar170._8_4_ * auVar170._8_4_ * auVar168._8_4_;
              auVar80._12_4_ = auVar170._12_4_ * auVar170._12_4_ * auVar170._12_4_ * auVar168._12_4_
              ;
              auVar80._16_4_ = auVar170._16_4_ * auVar170._16_4_ * auVar170._16_4_ * auVar168._16_4_
              ;
              auVar80._20_4_ = auVar170._20_4_ * auVar170._20_4_ * auVar170._20_4_ * auVar168._20_4_
              ;
              auVar80._24_4_ = auVar170._24_4_ * auVar170._24_4_ * auVar170._24_4_ * auVar168._24_4_
              ;
              auVar80._28_4_ = auVar168._28_4_;
              auVar63._8_4_ = 0xffffff82;
              auVar63._0_8_ = 0xffffff82ffffff82;
              auVar63._12_4_ = 0xffffff82;
              auVar63._16_4_ = 0xffffff82;
              auVar63._20_4_ = 0xffffff82;
              auVar63._24_4_ = 0xffffff82;
              auVar63._28_4_ = 0xffffff82;
              auVar168 = vpaddd_avx512vl(auVar162,auVar63);
              auVar168 = vcvtdq2ps_avx(auVar168);
              auVar160 = vsubps_avx512vl(auVar168,auVar231);
              bVar15 = (bool)((byte)uVar17 & 1);
              auVar171._0_4_ = (uint)bVar15 * auVar160._0_4_ | (uint)!bVar15 * auVar168._0_4_;
              bVar15 = (bool)((byte)(uVar17 >> 1) & 1);
              auVar171._4_4_ = (uint)bVar15 * auVar160._4_4_ | (uint)!bVar15 * auVar168._4_4_;
              bVar15 = (bool)((byte)(uVar17 >> 2) & 1);
              auVar171._8_4_ = (uint)bVar15 * auVar160._8_4_ | (uint)!bVar15 * auVar168._8_4_;
              bVar15 = (bool)((byte)(uVar17 >> 3) & 1);
              auVar171._12_4_ = (uint)bVar15 * auVar160._12_4_ | (uint)!bVar15 * auVar168._12_4_;
              bVar15 = (bool)((byte)(uVar17 >> 4) & 1);
              auVar171._16_4_ = (uint)bVar15 * auVar160._16_4_ | (uint)!bVar15 * auVar168._16_4_;
              bVar15 = (bool)((byte)(uVar17 >> 5) & 1);
              auVar171._20_4_ = (uint)bVar15 * auVar160._20_4_ | (uint)!bVar15 * auVar168._20_4_;
              bVar15 = (bool)((byte)(uVar17 >> 6) & 1);
              auVar171._24_4_ = (uint)bVar15 * auVar160._24_4_ | (uint)!bVar15 * auVar168._24_4_;
              bVar15 = SUB81(uVar17 >> 7,0);
              auVar171._28_4_ = (uint)bVar15 * auVar160._28_4_ | (uint)!bVar15 * auVar168._28_4_;
              auVar121 = vfmadd231ps_fma(auVar80,auVar171,auVar261);
              auVar121 = vfmsub231ps_fma(ZEXT1632(auVar121),auVar221,auVar79);
              auVar168 = vsubps_avx(ZEXT1632(auVar121),auVar170);
              auVar121 = vfmsub231ps_fma(auVar168,auVar234,auVar171);
              auVar168 = vmulps_avx512vl(ZEXT1632(auVar121),auVar159);
              auVar160 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              bVar15 = (bool)((byte)uVar101 & 1);
              auVar172._0_4_ = (uint)bVar15 * auVar160._0_4_ | (uint)!bVar15 * auVar168._0_4_;
              bVar15 = (bool)((byte)(uVar101 >> 1) & 1);
              auVar172._4_4_ = (uint)bVar15 * auVar160._4_4_ | (uint)!bVar15 * auVar168._4_4_;
              bVar15 = (bool)((byte)(uVar101 >> 2) & 1);
              auVar172._8_4_ = (uint)bVar15 * auVar160._8_4_ | (uint)!bVar15 * auVar168._8_4_;
              bVar15 = (bool)((byte)(uVar101 >> 3) & 1);
              auVar172._12_4_ = (uint)bVar15 * auVar160._12_4_ | (uint)!bVar15 * auVar168._12_4_;
              bVar15 = (bool)((byte)(uVar101 >> 4) & 1);
              auVar172._16_4_ = (uint)bVar15 * auVar160._16_4_ | (uint)!bVar15 * auVar168._16_4_;
              bVar15 = (bool)((byte)(uVar101 >> 5) & 1);
              auVar172._20_4_ = (uint)bVar15 * auVar160._20_4_ | (uint)!bVar15 * auVar168._20_4_;
              bVar15 = (bool)((byte)(uVar101 >> 6) & 1);
              auVar172._24_4_ = (uint)bVar15 * auVar160._24_4_ | (uint)!bVar15 * auVar168._24_4_;
              bVar15 = SUB81(uVar101 >> 7,0);
              auVar172._28_4_ = (uint)bVar15 * auVar160._28_4_ | (uint)!bVar15 * auVar168._28_4_;
              auVar168 = vminps_avx512vl(auVar172,auVar147);
              auVar160 = vmaxps_avx512vl(auVar168,auVar148);
              auVar121 = vfmadd213ps_fma(auVar149,auVar160,auVar221);
              auVar168 = vroundps_avx(ZEXT1632(auVar121),1);
              uVar101 = vcmpps_avx512vl(ZEXT1632(auVar121),auVar168,1);
              auVar161 = vsubps_avx512vl(auVar168,auVar231);
              bVar15 = (bool)((byte)uVar101 & 1);
              auVar173._0_4_ =
                   (float)((uint)bVar15 * auVar161._0_4_ | (uint)!bVar15 * auVar168._0_4_);
              bVar15 = (bool)((byte)(uVar101 >> 1) & 1);
              auVar173._4_4_ =
                   (float)((uint)bVar15 * auVar161._4_4_ | (uint)!bVar15 * auVar168._4_4_);
              bVar15 = (bool)((byte)(uVar101 >> 2) & 1);
              auVar173._8_4_ =
                   (float)((uint)bVar15 * auVar161._8_4_ | (uint)!bVar15 * auVar168._8_4_);
              bVar15 = (bool)((byte)(uVar101 >> 3) & 1);
              auVar173._12_4_ =
                   (float)((uint)bVar15 * auVar161._12_4_ | (uint)!bVar15 * auVar168._12_4_);
              bVar15 = (bool)((byte)(uVar101 >> 4) & 1);
              auVar173._16_4_ =
                   (float)((uint)bVar15 * auVar161._16_4_ | (uint)!bVar15 * auVar168._16_4_);
              bVar15 = (bool)((byte)(uVar101 >> 5) & 1);
              auVar173._20_4_ =
                   (float)((uint)bVar15 * auVar161._20_4_ | (uint)!bVar15 * auVar168._20_4_);
              bVar15 = (bool)((byte)(uVar101 >> 6) & 1);
              auVar173._24_4_ =
                   (float)((uint)bVar15 * auVar161._24_4_ | (uint)!bVar15 * auVar168._24_4_);
              bVar15 = SUB81(uVar101 >> 7,0);
              auVar173._28_4_ =
                   (float)((uint)bVar15 * auVar161._28_4_ | (uint)!bVar15 * auVar168._28_4_);
              auVar121 = vfmsub231ps_fma(auVar160,auVar173,auVar234);
              auVar122 = vfnmsub231ps_fma(ZEXT1632(auVar121),auVar173,auVar261);
              auVar160 = ZEXT1632(auVar122);
              auVar168 = vfmadd213ps_avx512vl(auVar241,auVar160,auVar150);
              auVar168 = vfmadd213ps_avx512vl(auVar168,auVar160,auVar151);
              auVar168 = vfmadd213ps_avx512vl(auVar168,auVar160,auVar152);
              auVar160 = ZEXT1632(auVar122);
              auVar121 = vfmadd213ps_fma(auVar168,auVar160,auVar255);
              auVar121 = vfmadd213ps_fma(ZEXT1632(auVar121),auVar160,auVar221);
              auVar121 = vfmadd213ps_fma(ZEXT1632(auVar121),
                                         ZEXT1632(CONCAT412(auVar122._12_4_ * auVar122._12_4_,
                                                            CONCAT48(auVar122._8_4_ * auVar122._8_4_
                                                                     ,CONCAT44(auVar122._4_4_ *
                                                                               auVar122._4_4_,
                                                                               auVar122._0_4_ *
                                                                               auVar122._0_4_)))),
                                         auVar160);
              auVar201._0_4_ = auVar121._0_4_ + 1.0;
              auVar201._4_4_ = auVar121._4_4_ + 1.0;
              auVar201._8_4_ = auVar121._8_4_ + 1.0;
              auVar201._12_4_ = auVar121._12_4_ + 1.0;
              auVar201._16_4_ = 0x3f800000;
              auVar201._20_4_ = 0x3f800000;
              auVar201._24_4_ = 0x3f800000;
              auVar201._28_4_ = 0x3f800000;
              auVar212._0_4_ = (int)auVar173._0_4_;
              auVar212._4_4_ = (int)auVar173._4_4_;
              auVar212._8_4_ = (int)auVar173._8_4_;
              auVar212._12_4_ = (int)auVar173._12_4_;
              auVar212._16_4_ = (int)auVar173._16_4_;
              auVar212._20_4_ = (int)auVar173._20_4_;
              auVar212._24_4_ = (int)auVar173._24_4_;
              auVar212._28_4_ = (int)auVar173._28_4_;
              auVar168 = vpslld_avx2(auVar212,0x17);
              auVar168 = vpaddd_avx2(auVar259,auVar168);
              auVar121 = vfmadd213ps_fma(auVar168,auVar201,auVar231);
              auVar168 = vrcpps_avx(ZEXT1632(auVar121));
              auVar121 = vfmsub213ps_fma(ZEXT1632(auVar121),auVar168,auVar231);
              auVar121 = vfnmadd132ps_fma(ZEXT1632(auVar121),auVar168,auVar168);
              auVar168 = vfnmadd213ps_avx512vl(ZEXT1632(auVar121),auVar159,auVar153);
              auVar174._4_4_ = auVar168._4_4_ * auVar174._4_4_;
              auVar174._0_4_ = auVar168._0_4_ * auVar174._0_4_;
              auVar174._8_4_ = auVar168._8_4_ * auVar174._8_4_;
              auVar174._12_4_ = auVar168._12_4_ * auVar174._12_4_;
              auVar174._16_4_ = auVar168._16_4_ * auVar174._16_4_;
              auVar174._20_4_ = auVar168._20_4_ * auVar174._20_4_;
              auVar174._24_4_ = auVar168._24_4_ * auVar174._24_4_;
              break;
            case 6:
              uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var10);
              auVar203._4_4_ = uVar7;
              auVar203._0_4_ = uVar7;
              auVar203._8_4_ = uVar7;
              auVar203._12_4_ = uVar7;
              auVar203._16_4_ = uVar7;
              auVar203._20_4_ = uVar7;
              auVar203._24_4_ = uVar7;
              auVar203._28_4_ = uVar7;
              uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var10))[1];
              auVar55._4_4_ = uVar7;
              auVar55._0_4_ = uVar7;
              auVar55._8_4_ = uVar7;
              auVar55._12_4_ = uVar7;
              auVar55._16_4_ = uVar7;
              auVar55._20_4_ = uVar7;
              auVar55._24_4_ = uVar7;
              auVar55._28_4_ = uVar7;
              auVar160 = vfmadd213ps_avx512vl(auVar203,auVar174,auVar55);
              auVar168 = vmaxps_avx512vl(auVar160,auVar168);
              auVar168 = vminps_avx(auVar168,auVar231);
              auVar174._4_4_ = auVar168._4_4_ * auVar174._4_4_;
              auVar174._0_4_ = auVar168._0_4_ * auVar174._0_4_;
              auVar174._8_4_ = auVar168._8_4_ * auVar174._8_4_;
              auVar174._12_4_ = auVar168._12_4_ * auVar174._12_4_;
              auVar174._16_4_ = auVar168._16_4_ * auVar174._16_4_;
              auVar174._20_4_ = auVar168._20_4_ * auVar174._20_4_;
              auVar174._24_4_ = auVar168._24_4_ * auVar174._24_4_;
            }
          }
          *(undefined1 (*) [32])((long)top_blob->data + uVar102 * 0x20) = auVar174;
          uVar102 = uVar102 + 1;
          lVar110 = lVar110 + local_90;
          lVar111 = lVar111 + local_90;
          lVar115 = lVar115 + local_90;
          local_108 = local_108 + local_90;
          local_110 = local_110 + local_90;
          lVar113 = lVar113 + local_90;
          local_100 = local_100 + local_90;
          local_118 = local_118 + local_90;
          local_a8 = p_Var10;
          local_80 = (ulong)uVar9;
        } while (uVar102 != local_88);
      }
      uVar102 = (long)(int)uVar100 & 0xfffffffffffffff8;
      if ((uVar100 >> 2 & 1) != 0) {
        if (lVar12 == 0) {
          auVar120 = ZEXT816(0) << 0x40;
        }
        else {
          auVar120 = *(undefined1 (*) [16])(lVar12 + uVar102 * 4);
        }
        pvVar13 = (this->weight_data_tm).data;
        pvVar104 = (void *)((long)pvVar13 + uVar102 * lVar112 * 4);
        if ((int)uVar118 < 8) {
          uVar114 = 0;
          lVar113 = (uVar102 | 1) * lVar112 * 4;
          lVar111 = (uVar102 | 2) * lVar112 * 4;
          lVar115 = (uVar102 | 3) * lVar112 * 4;
          auVar121 = ZEXT816(0);
          auVar122 = ZEXT816(0);
          auVar123 = ZEXT816(0);
          auVar124 = ZEXT816(0);
          pauVar99 = local_f8;
        }
        else {
          uVar114 = uVar118 & 0xfffffff8;
          lVar113 = (uVar102 + 3) * lVar112;
          lVar111 = (uVar102 + 2) * lVar112;
          lVar116 = (uVar102 + 1) * lVar112;
          auVar124 = ZEXT816(0);
          iVar97 = 7;
          auVar123 = ZEXT816(0);
          auVar122 = ZEXT816(0);
          auVar121 = ZEXT816(0);
          lVar110 = 0;
          do {
            lVar117 = lVar110;
            auVar147 = *(undefined1 (*) [32])(*local_f8 + lVar117);
            auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar147,
                                       *(undefined1 (*) [32])((long)pvVar104 + lVar117));
            auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar147,
                                       *(undefined1 (*) [32])((long)pvVar13 + lVar117 + lVar116 * 4)
                                      );
            auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar147,
                                       *(undefined1 (*) [32])((long)pvVar13 + lVar117 + lVar111 * 4)
                                      );
            auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),auVar147,
                                       *(undefined1 (*) [32])((long)pvVar13 + lVar117 + lVar113 * 4)
                                      );
            iVar97 = iVar97 + 8;
            lVar110 = lVar117 + 0x20;
          } while (iVar97 < (int)uVar118);
          lVar115 = lVar110 + lVar113 * 4;
          lVar111 = lVar110 + lVar111 * 4;
          lVar113 = lVar110 + lVar116 * 4;
          pvVar104 = (void *)((long)pvVar104 + lVar110);
          pauVar99 = (undefined1 (*) [32])(local_f8[1] + lVar117);
        }
        lVar113 = (long)pvVar13 + lVar113;
        lVar111 = (long)pvVar13 + lVar111;
        lVar115 = (long)pvVar13 + lVar115;
        auVar125 = ZEXT816(0) << 0x40;
        if ((int)(uVar114 | 3) < (int)uVar118) {
          auVar191 = ZEXT816(0);
          lVar110 = 0;
          auVar127 = ZEXT816(0);
          auVar243 = ZEXT864(0);
          uVar107 = uVar114;
          do {
            auVar132 = *(undefined1 (*) [16])(*pauVar99 + lVar110);
            auVar125 = vfmadd231ps_fma(auVar125,auVar132,
                                       *(undefined1 (*) [16])((long)pvVar104 + lVar110));
            auVar126 = vfmadd231ps_fma(auVar243._0_16_,auVar132,
                                       *(undefined1 (*) [16])(lVar113 + lVar110));
            auVar243 = ZEXT1664(auVar126);
            auVar127 = vfmadd231ps_fma(auVar127,auVar132,*(undefined1 (*) [16])(lVar111 + lVar110));
            auVar191 = vfmadd231ps_fma(auVar191,auVar132,*(undefined1 (*) [16])(lVar115 + lVar110));
            uVar114 = uVar107 + 4;
            iVar97 = uVar107 + 7;
            lVar110 = lVar110 + 0x10;
            uVar107 = uVar114;
          } while (iVar97 < (int)uVar118);
          pauVar99 = (undefined1 (*) [32])(*pauVar99 + lVar110);
          lVar115 = lVar115 + lVar110;
          lVar111 = lVar111 + lVar110;
          lVar113 = lVar113 + lVar110;
          pvVar104 = (void *)((long)pvVar104 + lVar110);
        }
        else {
          auVar126 = SUB6416(ZEXT864(0),0);
          auVar127 = ZEXT816(0);
          auVar191 = ZEXT816(0);
        }
        if (uVar118 - uVar114 != 0 && (int)uVar114 <= (int)uVar118) {
          lVar110 = 0;
          do {
            auVar132 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar104 + lVar110 * 4)),
                                     ZEXT416(*(uint *)(lVar113 + lVar110 * 4)),0x10);
            auVar132 = vinsertps_avx(auVar132,ZEXT416(*(uint *)(lVar111 + lVar110 * 4)),0x20);
            auVar132 = vinsertps_avx(auVar132,ZEXT416(*(uint *)(lVar115 + lVar110 * 4)),0x30);
            uVar7 = *(undefined4 *)(*pauVar99 + lVar110 * 4);
            auVar129._4_4_ = uVar7;
            auVar129._0_4_ = uVar7;
            auVar129._8_4_ = uVar7;
            auVar129._12_4_ = uVar7;
            auVar120 = vfmadd231ps_avx512vl(auVar120,auVar132,auVar129);
            lVar110 = lVar110 + 1;
          } while (uVar118 - uVar114 != (int)lVar110);
        }
        auVar147 = vhaddps_avx(ZEXT1632(auVar121),ZEXT1632(auVar122));
        auVar148 = vhaddps_avx(ZEXT1632(auVar123),ZEXT1632(auVar124));
        auVar147 = vhaddps_avx(auVar147,auVar148);
        auVar123 = vunpcklps_avx(auVar125,auVar126);
        auVar124 = vunpcklps_avx(auVar127,auVar191);
        auVar121 = vunpckhps_avx(auVar125,auVar126);
        auVar125 = vunpckhps_avx(auVar127,auVar191);
        auVar122 = vmovlhps_avx(auVar123,auVar124);
        auVar124 = vunpckhpd_avx(auVar123,auVar124);
        auVar123 = vmovlhps_avx(auVar121,auVar125);
        auVar125 = vunpckhpd_avx(auVar121,auVar125);
        auVar121._0_4_ =
             auVar124._0_4_ + auVar122._0_4_ + auVar123._0_4_ + auVar125._0_4_ + auVar147._0_4_ +
             auVar120._0_4_ + auVar147._16_4_;
        auVar121._4_4_ =
             auVar124._4_4_ + auVar122._4_4_ + auVar123._4_4_ + auVar125._4_4_ + auVar147._4_4_ +
             auVar120._4_4_ + auVar147._20_4_;
        auVar121._8_4_ =
             auVar124._8_4_ + auVar122._8_4_ + auVar123._8_4_ + auVar125._8_4_ + auVar147._8_4_ +
             auVar120._8_4_ + auVar147._24_4_;
        auVar121._12_4_ =
             auVar124._12_4_ + auVar122._12_4_ + auVar123._12_4_ + auVar125._12_4_ + auVar147._12_4_
             + auVar120._12_4_ + auVar147._28_4_;
        switch(uVar9) {
        case 1:
          auVar83._12_4_ = 0;
          auVar83._0_12_ = ZEXT412(0);
          auVar121 = vmaxps_avx(auVar121,auVar83 << 0x20);
          break;
        case 2:
          auVar84._12_4_ = 0;
          auVar84._0_12_ = ZEXT412(0);
          auVar120 = vmaxps_avx(auVar121,auVar84 << 0x20);
          auVar121 = vminps_avx(auVar121,auVar84 << 0x20);
          uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var10);
          auVar51._4_4_ = uVar7;
          auVar51._0_4_ = uVar7;
          auVar51._8_4_ = uVar7;
          auVar51._12_4_ = uVar7;
          auVar121 = vfmadd132ps_avx512vl(auVar121,auVar120,auVar51);
          break;
        case 3:
          uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var10);
          auVar49._4_4_ = uVar7;
          auVar49._0_4_ = uVar7;
          auVar49._8_4_ = uVar7;
          auVar49._12_4_ = uVar7;
          auVar120 = vmaxps_avx512vl(auVar121,auVar49);
          uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var10))[1];
          auVar50._4_4_ = uVar7;
          auVar50._0_4_ = uVar7;
          auVar50._8_4_ = uVar7;
          auVar50._12_4_ = uVar7;
          auVar121 = vminps_avx512vl(auVar120,auVar50);
          break;
        case 4:
          auVar39._8_4_ = 0x80000000;
          auVar39._0_8_ = 0x8000000080000000;
          auVar39._12_4_ = 0x80000000;
          auVar120 = vxorps_avx512vl(auVar121,auVar39);
          auVar40._8_4_ = 0x42b0c0a5;
          auVar40._0_8_ = 0x42b0c0a542b0c0a5;
          auVar40._12_4_ = 0x42b0c0a5;
          auVar120 = vminps_avx512vl(auVar120,auVar40);
          auVar41._8_4_ = 0xc2b0c0a5;
          auVar41._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar41._12_4_ = 0xc2b0c0a5;
          auVar122 = vmaxps_avx512vl(auVar120,auVar41);
          auVar196._8_4_ = 0x3f000000;
          auVar196._0_8_ = 0x3f0000003f000000;
          auVar196._12_4_ = 0x3f000000;
          auVar209._8_4_ = 0x3fb8aa3b;
          auVar209._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar209._12_4_ = 0x3fb8aa3b;
          auVar121 = vfmadd213ps_fma(auVar209,auVar122,auVar196);
          auVar220._0_4_ = (int)auVar121._0_4_;
          auVar220._4_4_ = (int)auVar121._4_4_;
          auVar220._8_4_ = (int)auVar121._8_4_;
          auVar220._12_4_ = (int)auVar121._12_4_;
          auVar120 = vcvtdq2ps_avx(auVar220);
          auVar225._8_4_ = 0x3f800000;
          auVar225._0_8_ = 0x3f8000003f800000;
          auVar225._12_4_ = 0x3f800000;
          uVar101 = vcmpps_avx512vl(auVar121,auVar120,1);
          auVar121 = vsubps_avx512vl(auVar120,auVar225);
          bVar15 = (bool)((byte)uVar101 & 1);
          auVar145._0_4_ = (float)((uint)bVar15 * auVar121._0_4_ | (uint)!bVar15 * auVar120._0_4_);
          bVar15 = (bool)((byte)(uVar101 >> 1) & 1);
          auVar145._4_4_ = (float)((uint)bVar15 * auVar121._4_4_ | (uint)!bVar15 * auVar120._4_4_);
          bVar15 = (bool)((byte)(uVar101 >> 2) & 1);
          auVar145._8_4_ = (float)((uint)bVar15 * auVar121._8_4_ | (uint)!bVar15 * auVar120._8_4_);
          bVar15 = (bool)((byte)(uVar101 >> 3) & 1);
          auVar145._12_4_ =
               (float)((uint)bVar15 * auVar121._12_4_ | (uint)!bVar15 * auVar120._12_4_);
          auVar42._8_4_ = 0x3f318000;
          auVar42._0_8_ = 0x3f3180003f318000;
          auVar42._12_4_ = 0x3f318000;
          auVar120 = vfmsub231ps_avx512vl(auVar122,auVar145,auVar42);
          auVar43._8_4_ = 0x395e8083;
          auVar43._0_8_ = 0x395e8083395e8083;
          auVar43._12_4_ = 0x395e8083;
          auVar121 = vfmsub231ps_avx512vl(auVar120,auVar145,auVar43);
          auVar210._8_4_ = 0x39506967;
          auVar210._0_8_ = 0x3950696739506967;
          auVar210._12_4_ = 0x39506967;
          auVar44._8_4_ = 0x3ab743ce;
          auVar44._0_8_ = 0x3ab743ce3ab743ce;
          auVar44._12_4_ = 0x3ab743ce;
          auVar120 = vfmadd213ps_avx512vl(auVar210,auVar121,auVar44);
          auVar45._8_4_ = 0x3c088908;
          auVar45._0_8_ = 0x3c0889083c088908;
          auVar45._12_4_ = 0x3c088908;
          auVar120 = vfmadd213ps_avx512vl(auVar120,auVar121,auVar45);
          auVar46._8_4_ = 0x3d2aa9c1;
          auVar46._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar46._12_4_ = 0x3d2aa9c1;
          auVar120 = vfmadd213ps_avx512vl(auVar120,auVar121,auVar46);
          auVar47._8_4_ = 0x3e2aaaaa;
          auVar47._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar47._12_4_ = 0x3e2aaaaa;
          auVar120 = vfmadd213ps_avx512vl(auVar120,auVar121,auVar47);
          auVar230._0_4_ = auVar121._0_4_ * auVar121._0_4_;
          auVar230._4_4_ = auVar121._4_4_ * auVar121._4_4_;
          auVar230._8_4_ = auVar121._8_4_ * auVar121._8_4_;
          auVar230._12_4_ = auVar121._12_4_ * auVar121._12_4_;
          auVar120 = vfmadd213ps_fma(auVar120,auVar121,auVar196);
          auVar120 = vfmadd213ps_fma(auVar120,auVar230,auVar121);
          auVar197._0_4_ = auVar120._0_4_ + 1.0;
          auVar197._4_4_ = auVar120._4_4_ + 1.0;
          auVar197._8_4_ = auVar120._8_4_ + 1.0;
          auVar197._12_4_ = auVar120._12_4_ + 1.0;
          auVar192._0_4_ = (int)auVar145._0_4_;
          auVar192._4_4_ = (int)auVar145._4_4_;
          auVar192._8_4_ = (int)auVar145._8_4_;
          auVar192._12_4_ = (int)auVar145._12_4_;
          auVar120 = vpslld_avx(auVar192,0x17);
          auVar48._8_4_ = 0x3f800000;
          auVar48._0_8_ = 0x3f8000003f800000;
          auVar48._12_4_ = 0x3f800000;
          auVar120 = vpaddd_avx512vl(auVar120,auVar48);
          auVar121 = vfmadd213ps_fma(auVar120,auVar197,auVar225);
          auVar120 = vrcpps_avx(auVar121);
          auVar121 = vfmsub213ps_fma(auVar121,auVar120,auVar225);
          auVar121 = vfnmadd132ps_fma(auVar121,auVar120,auVar120);
          break;
        case 5:
          auVar233._8_4_ = 0x42b0c0a5;
          auVar233._0_8_ = 0x42b0c0a542b0c0a5;
          auVar233._12_4_ = 0x42b0c0a5;
          auVar120 = vminps_avx(auVar121,auVar233);
          auVar236._8_4_ = 0xc2b0c0a5;
          auVar236._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar236._12_4_ = 0xc2b0c0a5;
          auVar223._8_4_ = 0x3fb8aa3b;
          auVar223._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar223._12_4_ = 0x3fb8aa3b;
          auVar122 = vmaxps_avx(auVar120,auVar236);
          auVar206._8_4_ = 0x3f000000;
          auVar206._0_8_ = 0x3f0000003f000000;
          auVar206._12_4_ = 0x3f000000;
          auVar123 = vfmadd213ps_fma(auVar223,auVar122,auVar206);
          auVar217._0_4_ = (int)auVar123._0_4_;
          auVar217._4_4_ = (int)auVar123._4_4_;
          auVar217._8_4_ = (int)auVar123._8_4_;
          auVar217._12_4_ = (int)auVar123._12_4_;
          auVar120 = vcvtdq2ps_avx(auVar217);
          uVar101 = vcmpps_avx512vl(auVar123,auVar120,1);
          auVar195._8_4_ = 0x3f800000;
          auVar195._0_8_ = 0x3f8000003f800000;
          auVar195._12_4_ = 0x3f800000;
          auVar218._8_4_ = 0x3f318000;
          auVar218._0_8_ = 0x3f3180003f318000;
          auVar218._12_4_ = 0x3f318000;
          auVar123 = vsubps_avx512vl(auVar120,auVar195);
          bVar15 = (bool)((byte)uVar101 & 1);
          auVar140._0_4_ = (float)((uint)bVar15 * auVar123._0_4_ | (uint)!bVar15 * auVar120._0_4_);
          bVar15 = (bool)((byte)(uVar101 >> 1) & 1);
          auVar140._4_4_ = (float)((uint)bVar15 * auVar123._4_4_ | (uint)!bVar15 * auVar120._4_4_);
          bVar15 = (bool)((byte)(uVar101 >> 2) & 1);
          auVar140._8_4_ = (float)((uint)bVar15 * auVar123._8_4_ | (uint)!bVar15 * auVar120._8_4_);
          bVar15 = (bool)((byte)(uVar101 >> 3) & 1);
          auVar140._12_4_ =
               (float)((uint)bVar15 * auVar123._12_4_ | (uint)!bVar15 * auVar120._12_4_);
          auVar120 = vfmsub231ps_fma(auVar122,auVar140,auVar218);
          auVar240._8_4_ = 0xb95e8083;
          auVar240._0_8_ = 0xb95e8083b95e8083;
          auVar240._12_4_ = 0xb95e8083;
          auVar120 = vfnmsub231ps_fma(auVar120,auVar140,auVar240);
          auVar263._0_4_ = auVar120._0_4_ * auVar120._0_4_;
          auVar263._4_4_ = auVar120._4_4_ * auVar120._4_4_;
          auVar263._8_4_ = auVar120._8_4_ * auVar120._8_4_;
          auVar263._12_4_ = auVar120._12_4_ * auVar120._12_4_;
          auVar245._8_4_ = 0x3ab743ce;
          auVar245._0_8_ = 0x3ab743ce3ab743ce;
          auVar245._12_4_ = 0x3ab743ce;
          auVar229._8_4_ = 0x39506967;
          auVar229._0_8_ = 0x3950696739506967;
          auVar229._12_4_ = 0x39506967;
          auVar122 = vfmadd213ps_avx512vl(auVar229,auVar120,auVar245);
          auVar248._8_4_ = 0x3c088908;
          auVar248._0_8_ = 0x3c0889083c088908;
          auVar248._12_4_ = 0x3c088908;
          auVar251._8_4_ = 0x3d2aa9c1;
          auVar251._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar251._12_4_ = 0x3d2aa9c1;
          auVar122 = vfmadd213ps_avx512vl(auVar122,auVar120,auVar248);
          auVar122 = vfmadd213ps_avx512vl(auVar122,auVar120,auVar251);
          auVar254._8_4_ = 0x3e2aaaaa;
          auVar254._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar254._12_4_ = 0x3e2aaaaa;
          auVar122 = vfmadd213ps_avx512vl(auVar122,auVar120,auVar254);
          auVar122 = vfmadd213ps_avx512vl(auVar122,auVar120,auVar206);
          auVar122 = vfmadd213ps_avx512vl(auVar122,auVar263,auVar120);
          auVar123 = vaddps_avx512vl(auVar122,auVar195);
          auVar257._0_4_ = (int)auVar140._0_4_;
          auVar257._4_4_ = (int)auVar140._4_4_;
          auVar257._8_4_ = (int)auVar140._8_4_;
          auVar257._12_4_ = (int)auVar140._12_4_;
          auVar120 = vpslld_avx(auVar257,0x17);
          auVar258._8_4_ = 0x3f800000;
          auVar258._0_8_ = 0x3f8000003f800000;
          auVar258._12_4_ = 0x3f800000;
          auVar120 = vpaddd_avx(auVar120,auVar258);
          auVar120 = vfmadd213ps_fma(auVar120,auVar123,auVar195);
          auVar124._8_4_ = 0x800000;
          auVar124._0_8_ = 0x80000000800000;
          auVar124._12_4_ = 0x800000;
          auVar123 = vmaxps_avx512vl(auVar120,auVar124);
          auVar122 = vxorps_avx512vl(auVar122,auVar122);
          auVar124 = vpsrld_avx512vl(auVar123,0x17);
          auVar126 = vpbroadcastd_avx512vl(ZEXT416(0x3f000000));
          auVar125._8_4_ = 0x807fffff;
          auVar125._0_8_ = 0x807fffff807fffff;
          auVar125._12_4_ = 0x807fffff;
          auVar123 = vpternlogd_avx512vl(auVar126,auVar123,auVar125,0xf8);
          auVar126._8_4_ = 0xffffff82;
          auVar126._0_8_ = 0xffffff82ffffff82;
          auVar126._12_4_ = 0xffffff82;
          auVar124 = vpaddd_avx512vl(auVar124,auVar126);
          uVar101 = vcmpps_avx512vl(auVar120,auVar122,2);
          auVar120 = vcvtdq2ps_avx(auVar124);
          auVar127._8_4_ = 0x3f3504f3;
          auVar127._0_8_ = 0x3f3504f33f3504f3;
          auVar127._12_4_ = 0x3f3504f3;
          uVar17 = vcmpps_avx512vl(auVar123,auVar127,1);
          auVar191._8_4_ = 0xbf800000;
          auVar191._0_8_ = 0xbf800000bf800000;
          auVar191._12_4_ = 0xbf800000;
          auVar122 = vaddps_avx512vl(auVar123,auVar191);
          auVar124 = vsubps_avx512vl(auVar120,auVar195);
          bVar15 = (bool)((byte)uVar17 & 1);
          auVar141._0_4_ = (uint)bVar15 * auVar124._0_4_ | (uint)!bVar15 * auVar120._0_4_;
          bVar15 = (bool)((byte)(uVar17 >> 1) & 1);
          auVar141._4_4_ = (uint)bVar15 * auVar124._4_4_ | (uint)!bVar15 * auVar120._4_4_;
          bVar15 = (bool)((byte)(uVar17 >> 2) & 1);
          auVar141._8_4_ = (uint)bVar15 * auVar124._8_4_ | (uint)!bVar15 * auVar120._8_4_;
          bVar15 = (bool)((byte)(uVar17 >> 3) & 1);
          auVar141._12_4_ = (uint)bVar15 * auVar124._12_4_ | (uint)!bVar15 * auVar120._12_4_;
          auVar120 = vaddps_avx512vl(auVar122,auVar123);
          bVar15 = (bool)((byte)uVar17 & 1);
          auVar142._0_4_ = (uint)bVar15 * auVar120._0_4_ | (uint)!bVar15 * auVar122._0_4_;
          bVar15 = (bool)((byte)(uVar17 >> 1) & 1);
          auVar142._4_4_ = (uint)bVar15 * auVar120._4_4_ | (uint)!bVar15 * auVar122._4_4_;
          bVar15 = (bool)((byte)(uVar17 >> 2) & 1);
          auVar142._8_4_ = (uint)bVar15 * auVar120._8_4_ | (uint)!bVar15 * auVar122._8_4_;
          bVar15 = (bool)((byte)(uVar17 >> 3) & 1);
          auVar142._12_4_ = (uint)bVar15 * auVar120._12_4_ | (uint)!bVar15 * auVar122._12_4_;
          auVar120 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar132._8_4_ = 0xbdebd1b8;
          auVar132._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar132._12_4_ = 0xbdebd1b8;
          auVar120 = vfmadd213ps_avx512vl(auVar120,auVar142,auVar132);
          auVar128._8_4_ = 0x3def251a;
          auVar128._0_8_ = 0x3def251a3def251a;
          auVar128._12_4_ = 0x3def251a;
          auVar120 = vfmadd213ps_avx512vl(auVar120,auVar142,auVar128);
          auVar130._8_4_ = 0xbdfe5d4f;
          auVar130._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar130._12_4_ = 0xbdfe5d4f;
          auVar120 = vfmadd213ps_avx512vl(auVar120,auVar142,auVar130);
          auVar131._8_4_ = 0x3e11e9bf;
          auVar131._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar131._12_4_ = 0x3e11e9bf;
          auVar120 = vfmadd213ps_avx512vl(auVar120,auVar142,auVar131);
          auVar34._8_4_ = 0xbe2aae50;
          auVar34._0_8_ = 0xbe2aae50be2aae50;
          auVar34._12_4_ = 0xbe2aae50;
          auVar120 = vfmadd213ps_avx512vl(auVar120,auVar142,auVar34);
          auVar35._8_4_ = 0x3e4cceac;
          auVar35._0_8_ = 0x3e4cceac3e4cceac;
          auVar35._12_4_ = 0x3e4cceac;
          auVar120 = vfmadd213ps_avx512vl(auVar120,auVar142,auVar35);
          auVar36._8_4_ = 0xbe7ffffc;
          auVar36._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar36._12_4_ = 0xbe7ffffc;
          auVar120 = vfmadd213ps_avx512vl(auVar120,auVar142,auVar36);
          auVar122 = vmulps_avx512vl(auVar142,auVar142);
          auVar37._8_4_ = 0x3eaaaaaa;
          auVar37._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar37._12_4_ = 0x3eaaaaaa;
          auVar120 = vfmadd213ps_avx512vl(auVar120,auVar142,auVar37);
          auVar123 = vmulps_avx512vl(auVar122,auVar142);
          auVar120 = vmulps_avx512vl(auVar123,auVar120);
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar141,auVar240);
          auVar120 = vfmsub231ps_avx512vl(auVar120,auVar206,auVar122);
          auVar120 = vsubps_avx512vl(auVar120,auVar142);
          auVar120 = vfnmadd231ps_fma(auVar120,auVar218,auVar141);
          auVar122 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          bVar15 = (bool)((byte)uVar101 & 1);
          auVar143._0_4_ =
               (uint)bVar15 * auVar122._0_4_ |
               (uint)!bVar15 * (int)(auVar120._0_4_ + auVar120._0_4_);
          bVar15 = (bool)((byte)(uVar101 >> 1) & 1);
          auVar143._4_4_ =
               (uint)bVar15 * auVar122._4_4_ |
               (uint)!bVar15 * (int)(auVar120._4_4_ + auVar120._4_4_);
          bVar15 = (bool)((byte)(uVar101 >> 2) & 1);
          auVar143._8_4_ =
               (uint)bVar15 * auVar122._8_4_ |
               (uint)!bVar15 * (int)(auVar120._8_4_ + auVar120._8_4_);
          bVar15 = (bool)((byte)(uVar101 >> 3) & 1);
          auVar143._12_4_ =
               (uint)bVar15 * auVar122._12_4_ |
               (uint)!bVar15 * (int)(auVar120._12_4_ + auVar120._12_4_);
          auVar120 = vminps_avx(auVar143,auVar233);
          auVar122 = vmaxps_avx(auVar120,auVar236);
          auVar123 = vfmadd213ps_fma(auVar223,auVar122,auVar206);
          auVar237._0_4_ = (int)auVar123._0_4_;
          auVar237._4_4_ = (int)auVar123._4_4_;
          auVar237._8_4_ = (int)auVar123._8_4_;
          auVar237._12_4_ = (int)auVar123._12_4_;
          auVar120 = vcvtdq2ps_avx(auVar237);
          uVar101 = vcmpps_avx512vl(auVar123,auVar120,1);
          auVar123 = vsubps_avx512vl(auVar120,auVar195);
          bVar15 = (bool)((byte)uVar101 & 1);
          auVar144._0_4_ = (float)((uint)bVar15 * auVar123._0_4_ | (uint)!bVar15 * auVar120._0_4_);
          bVar15 = (bool)((byte)(uVar101 >> 1) & 1);
          auVar144._4_4_ = (float)((uint)bVar15 * auVar123._4_4_ | (uint)!bVar15 * auVar120._4_4_);
          bVar15 = (bool)((byte)(uVar101 >> 2) & 1);
          auVar144._8_4_ = (float)((uint)bVar15 * auVar123._8_4_ | (uint)!bVar15 * auVar120._8_4_);
          bVar15 = (bool)((byte)(uVar101 >> 3) & 1);
          auVar144._12_4_ =
               (float)((uint)bVar15 * auVar123._12_4_ | (uint)!bVar15 * auVar120._12_4_);
          auVar120 = vfmsub213ps_fma(auVar218,auVar144,auVar122);
          auVar122 = vfnmsub231ps_fma(auVar120,auVar144,auVar240);
          auVar224._0_4_ = auVar122._0_4_ * auVar122._0_4_;
          auVar224._4_4_ = auVar122._4_4_ * auVar122._4_4_;
          auVar224._8_4_ = auVar122._8_4_ * auVar122._8_4_;
          auVar224._12_4_ = auVar122._12_4_ * auVar122._12_4_;
          auVar120 = vfmadd213ps_fma(auVar229,auVar122,auVar245);
          auVar120 = vfmadd213ps_fma(auVar120,auVar122,auVar248);
          auVar120 = vfmadd213ps_fma(auVar120,auVar122,auVar251);
          auVar120 = vfmadd213ps_fma(auVar120,auVar122,auVar254);
          auVar120 = vfmadd213ps_fma(auVar120,auVar122,auVar206);
          auVar120 = vfmadd213ps_fma(auVar120,auVar224,auVar122);
          auVar207._0_4_ = auVar120._0_4_ + 1.0;
          auVar207._4_4_ = auVar120._4_4_ + 1.0;
          auVar207._8_4_ = auVar120._8_4_ + 1.0;
          auVar207._12_4_ = auVar120._12_4_ + 1.0;
          auVar219._0_4_ = (int)auVar144._0_4_;
          auVar219._4_4_ = (int)auVar144._4_4_;
          auVar219._8_4_ = (int)auVar144._8_4_;
          auVar219._12_4_ = (int)auVar144._12_4_;
          auVar120 = vpslld_avx(auVar219,0x17);
          auVar120 = vpaddd_avx(auVar258,auVar120);
          auVar122 = vfmadd213ps_fma(auVar120,auVar207,auVar195);
          auVar120 = vrcpps_avx(auVar122);
          auVar208._0_4_ = auVar120._0_4_ + auVar120._0_4_;
          auVar208._4_4_ = auVar120._4_4_ + auVar120._4_4_;
          auVar208._8_4_ = auVar120._8_4_ + auVar120._8_4_;
          auVar208._12_4_ = auVar120._12_4_ + auVar120._12_4_;
          auVar38._8_4_ = 0x40000000;
          auVar38._0_8_ = 0x4000000040000000;
          auVar38._12_4_ = 0x40000000;
          auVar122 = vfmsub213ps_avx512vl(auVar122,auVar208,auVar38);
          auVar120 = vfnmadd213ps_fma(auVar122,auVar120,auVar208);
          auVar121 = vfmsub231ps_fma(auVar121,auVar121,auVar120);
          break;
        case 6:
          uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var10);
          auVar123._4_4_ = uVar7;
          auVar123._0_4_ = uVar7;
          auVar123._8_4_ = uVar7;
          auVar123._12_4_ = uVar7;
          uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var10))[1];
          auVar120._4_4_ = uVar7;
          auVar120._0_4_ = uVar7;
          auVar120._8_4_ = uVar7;
          auVar120._12_4_ = uVar7;
          auVar120 = vfmadd213ps_avx512vl(auVar123,auVar121,auVar120);
          auVar120 = vmaxps_avx(auVar120,ZEXT816(0) << 0x20);
          auVar122._8_4_ = 0x3f800000;
          auVar122._0_8_ = 0x3f8000003f800000;
          auVar122._12_4_ = 0x3f800000;
          auVar120 = vminps_avx512vl(auVar120,auVar122);
          auVar121._0_4_ = auVar120._0_4_ * auVar121._0_4_;
          auVar121._4_4_ = auVar120._4_4_ * auVar121._4_4_;
          auVar121._8_4_ = auVar120._8_4_ * auVar121._8_4_;
          auVar121._12_4_ = auVar120._12_4_ * auVar121._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar102 * 4) = auVar121;
      }
      iVar106 = (int)uVar102 + (uVar100 >> 2 & 1) * 4;
      iVar97 = 0;
      if ((int)uVar100 <= iVar106) goto LAB_002a523f;
      pvVar104 = (this->weight_data_tm).data;
      pfVar14 = *(float **)(&this->field_0xe8 + (long)p_Var10);
      pvVar13 = top_blob->data;
      local_170 = uVar118 & 0xfffffff8;
      uVar102 = (ulong)iVar106;
      auVar265 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar243 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        fVar190 = 0.0;
        if (lVar12 != 0) {
          fVar190 = *(float *)(lVar12 + uVar102 * 4);
        }
        pauVar99 = (undefined1 (*) [32])((long)pvVar104 + uVar102 * lVar112 * 4);
        pauVar103 = pauVar108;
        if ((int)uVar118 < 8) {
          auVar147 = SUB6432(ZEXT864(0),0);
          uVar114 = 0;
        }
        else {
          auVar214 = ZEXT864(0);
          iVar97 = 7;
          do {
            auVar120 = vfmadd231ps_fma(auVar214._0_32_,*pauVar103,*pauVar99);
            auVar214 = ZEXT1664(auVar120);
            auVar147 = ZEXT1632(auVar120);
            pauVar103 = pauVar103 + 1;
            pauVar99 = pauVar99 + 1;
            iVar97 = iVar97 + 8;
            uVar114 = local_170;
          } while (iVar97 < (int)uVar118);
        }
        auVar120 = ZEXT816(0) << 0x40;
        uVar107 = uVar114 | 3;
        while ((int)uVar107 < (int)uVar118) {
          auVar120 = vfmadd231ps_fma(auVar120,*(undefined1 (*) [16])*pauVar103,
                                     *(undefined1 (*) [16])*pauVar99);
          pauVar103 = (undefined1 (*) [32])(*pauVar103 + 0x10);
          pauVar99 = (undefined1 (*) [32])(*pauVar99 + 0x10);
          uVar107 = uVar114 + 7;
          uVar114 = uVar114 + 4;
        }
        if ((int)uVar114 < (int)uVar118) {
          auVar227 = vpbroadcastq_avx512f();
          uVar101 = 0;
          auVar214 = ZEXT1264(CONCAT84(SUB128(ZEXT812(0),4),fVar190));
          do {
            auVar246 = auVar214;
            auVar214 = vpbroadcastq_avx512f();
            auVar238 = vporq_avx512f(auVar214,auVar265);
            auVar214 = vporq_avx512f(auVar214,auVar243);
            uVar19 = vpcmpuq_avx512f(auVar214,auVar227,2);
            bVar16 = (byte)uVar19;
            uVar19 = vpcmpuq_avx512f(auVar238,auVar227,2);
            bVar82 = (byte)uVar19;
            uVar119 = CONCAT11(bVar82,bVar16);
            piVar11 = (int *)(*pauVar103 + uVar101 * 4);
            auVar214._4_4_ = (uint)((byte)(uVar119 >> 1) & 1) * piVar11[1];
            auVar214._0_4_ = (uint)(bVar16 & 1) * *piVar11;
            auVar214._8_4_ = (uint)((byte)(uVar119 >> 2) & 1) * piVar11[2];
            auVar214._12_4_ = (uint)((byte)(uVar119 >> 3) & 1) * piVar11[3];
            auVar214._16_4_ = (uint)((byte)(uVar119 >> 4) & 1) * piVar11[4];
            auVar214._20_4_ = (uint)((byte)(uVar119 >> 5) & 1) * piVar11[5];
            auVar214._24_4_ = (uint)((byte)(uVar119 >> 6) & 1) * piVar11[6];
            auVar214._28_4_ = (uint)((byte)(uVar119 >> 7) & 1) * piVar11[7];
            auVar214._32_4_ = (uint)(bVar82 & 1) * piVar11[8];
            auVar214._36_4_ = (uint)(bVar82 >> 1 & 1) * piVar11[9];
            auVar214._40_4_ = (uint)(bVar82 >> 2 & 1) * piVar11[10];
            auVar214._44_4_ = (uint)(bVar82 >> 3 & 1) * piVar11[0xb];
            auVar214._48_4_ = (uint)(bVar82 >> 4 & 1) * piVar11[0xc];
            auVar214._52_4_ = (uint)(bVar82 >> 5 & 1) * piVar11[0xd];
            auVar214._56_4_ = (uint)(bVar82 >> 6 & 1) * piVar11[0xe];
            auVar214._60_4_ = (uint)(bVar82 >> 7) * piVar11[0xf];
            piVar11 = (int *)(*pauVar99 + uVar101 * 4);
            auVar238._4_4_ = (uint)((byte)(uVar119 >> 1) & 1) * piVar11[1];
            auVar238._0_4_ = (uint)(bVar16 & 1) * *piVar11;
            auVar238._8_4_ = (uint)((byte)(uVar119 >> 2) & 1) * piVar11[2];
            auVar238._12_4_ = (uint)((byte)(uVar119 >> 3) & 1) * piVar11[3];
            auVar238._16_4_ = (uint)((byte)(uVar119 >> 4) & 1) * piVar11[4];
            auVar238._20_4_ = (uint)((byte)(uVar119 >> 5) & 1) * piVar11[5];
            auVar238._24_4_ = (uint)((byte)(uVar119 >> 6) & 1) * piVar11[6];
            auVar238._28_4_ = (uint)((byte)(uVar119 >> 7) & 1) * piVar11[7];
            auVar238._32_4_ = (uint)(bVar82 & 1) * piVar11[8];
            auVar238._36_4_ = (uint)(bVar82 >> 1 & 1) * piVar11[9];
            auVar238._40_4_ = (uint)(bVar82 >> 2 & 1) * piVar11[10];
            auVar238._44_4_ = (uint)(bVar82 >> 3 & 1) * piVar11[0xb];
            auVar238._48_4_ = (uint)(bVar82 >> 4 & 1) * piVar11[0xc];
            auVar238._52_4_ = (uint)(bVar82 >> 5 & 1) * piVar11[0xd];
            auVar238._56_4_ = (uint)(bVar82 >> 6 & 1) * piVar11[0xe];
            auVar238._60_4_ = (uint)(bVar82 >> 7) * piVar11[0xf];
            auVar214 = vfmadd213ps_avx512f(auVar238,auVar214,auVar246);
            uVar101 = uVar101 + 0x10;
          } while (((ulong)(~uVar114 + uVar118) + 0x10 & 0xfffffffffffffff0) != uVar101);
          auVar227._0_4_ =
               (uint)(bVar16 & 1) * auVar214._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar246._0_4_;
          bVar15 = (bool)((byte)(uVar119 >> 1) & 1);
          auVar227._4_4_ = (uint)bVar15 * auVar214._4_4_ | (uint)!bVar15 * auVar246._4_4_;
          bVar15 = (bool)((byte)(uVar119 >> 2) & 1);
          auVar227._8_4_ = (uint)bVar15 * auVar214._8_4_ | (uint)!bVar15 * auVar246._8_4_;
          bVar15 = (bool)((byte)(uVar119 >> 3) & 1);
          auVar227._12_4_ = (uint)bVar15 * auVar214._12_4_ | (uint)!bVar15 * auVar246._12_4_;
          bVar15 = (bool)((byte)(uVar119 >> 4) & 1);
          auVar227._16_4_ = (uint)bVar15 * auVar214._16_4_ | (uint)!bVar15 * auVar246._16_4_;
          bVar15 = (bool)((byte)(uVar119 >> 5) & 1);
          auVar227._20_4_ = (uint)bVar15 * auVar214._20_4_ | (uint)!bVar15 * auVar246._20_4_;
          bVar15 = (bool)((byte)(uVar119 >> 6) & 1);
          auVar227._24_4_ = (uint)bVar15 * auVar214._24_4_ | (uint)!bVar15 * auVar246._24_4_;
          bVar15 = (bool)((byte)(uVar119 >> 7) & 1);
          auVar227._28_4_ = (uint)bVar15 * auVar214._28_4_ | (uint)!bVar15 * auVar246._28_4_;
          auVar227._32_4_ =
               (uint)(bVar82 & 1) * auVar214._32_4_ | (uint)!(bool)(bVar82 & 1) * auVar246._32_4_;
          bVar15 = (bool)(bVar82 >> 1 & 1);
          auVar227._36_4_ = (uint)bVar15 * auVar214._36_4_ | (uint)!bVar15 * auVar246._36_4_;
          bVar15 = (bool)(bVar82 >> 2 & 1);
          auVar227._40_4_ = (uint)bVar15 * auVar214._40_4_ | (uint)!bVar15 * auVar246._40_4_;
          bVar15 = (bool)(bVar82 >> 3 & 1);
          auVar227._44_4_ = (uint)bVar15 * auVar214._44_4_ | (uint)!bVar15 * auVar246._44_4_;
          bVar15 = (bool)(bVar82 >> 4 & 1);
          auVar227._48_4_ = (uint)bVar15 * auVar214._48_4_ | (uint)!bVar15 * auVar246._48_4_;
          bVar15 = (bool)(bVar82 >> 5 & 1);
          auVar227._52_4_ = (uint)bVar15 * auVar214._52_4_ | (uint)!bVar15 * auVar246._52_4_;
          bVar15 = (bool)(bVar82 >> 6 & 1);
          auVar227._56_4_ = (uint)bVar15 * auVar214._56_4_ | (uint)!bVar15 * auVar246._56_4_;
          auVar227._60_4_ =
               (uint)(bVar82 >> 7) * auVar214._60_4_ | (uint)!(bool)(bVar82 >> 7) * auVar246._60_4_;
          auVar148 = vextractf64x4_avx512f(auVar227,1);
          auVar214 = vaddps_avx512f(auVar227,ZEXT3264(auVar148));
          auVar198._0_4_ = auVar214._0_4_ + auVar214._16_4_;
          auVar198._4_4_ = auVar214._4_4_ + auVar214._20_4_;
          auVar198._8_4_ = auVar214._8_4_ + auVar214._24_4_;
          auVar198._12_4_ = auVar214._12_4_ + auVar214._28_4_;
          auVar121 = vshufpd_avx(auVar198,auVar198,1);
          auVar199._0_4_ = auVar198._0_4_ + auVar121._0_4_;
          auVar199._4_4_ = auVar198._4_4_ + auVar121._4_4_;
          auVar199._8_4_ = auVar198._8_4_ + auVar121._8_4_;
          auVar199._12_4_ = auVar198._12_4_ + auVar121._12_4_;
          auVar121 = vhaddps_avx(auVar199,auVar199);
          fVar190 = auVar121._0_4_;
        }
        auVar193._0_4_ = auVar147._0_4_ + auVar147._16_4_ + auVar120._0_4_;
        auVar193._4_4_ = auVar147._4_4_ + auVar147._20_4_ + auVar120._4_4_;
        auVar193._8_4_ = auVar147._8_4_ + auVar147._24_4_ + auVar120._8_4_;
        auVar193._12_4_ = auVar147._12_4_ + auVar147._28_4_ + auVar120._12_4_;
        auVar120 = vhaddps_avx(auVar193,auVar193);
        auVar120 = vhaddps_avx(auVar120,auVar120);
        fVar190 = auVar120._0_4_ + fVar190;
        fVar189 = fVar190;
        if (uVar9 - 1 < 6) {
          auVar120 = ZEXT416((uint)fVar190);
          switch(uVar9) {
          case 1:
            auVar120 = vmaxss_avx(auVar120,ZEXT416(0));
            fVar189 = auVar120._0_4_;
            break;
          case 2:
            uVar19 = vcmpss_avx512f(auVar120,ZEXT416(0),0xe);
            bVar15 = (bool)((byte)uVar19 & 1);
            fVar189 = (float)((uint)bVar15 * 0x3f800000 + (uint)!bVar15 * (int)*pfVar14) * fVar190;
            break;
          case 3:
            auVar120 = vmaxss_avx(auVar120,ZEXT416((uint)*pfVar14));
            fVar189 = auVar120._0_4_;
            if (pfVar14[1] < auVar120._0_4_) {
              fVar189 = pfVar14[1];
            }
            break;
          case 4:
            auVar120 = vminss_avx(auVar120,SUB6416(ZEXT464(0x42b0c0a5),0));
            auVar53._8_4_ = 0x80000000;
            auVar53._0_8_ = 0x8000000080000000;
            auVar53._12_4_ = 0x80000000;
            auVar121 = vxorps_avx512vl(auVar120,auVar53);
            uVar19 = vcmpss_avx512f(auVar120,ZEXT416(0xc2b0c0a5),1);
            bVar15 = (bool)((byte)uVar19 & 1);
            fVar190 = expf((float)((uint)bVar15 * 0x42b0c0a5 + (uint)!bVar15 * auVar121._0_4_));
            auVar243 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar265 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            fVar189 = 1.0 / (fVar190 + 1.0);
            break;
          case 5:
            fVar189 = expf(fVar190);
            fVar189 = logf(fVar189 + 1.0);
            fVar189 = tanhf(fVar189);
            auVar243 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar265 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            fVar189 = fVar189 * fVar190;
            break;
          case 6:
            fVar8 = *pfVar14;
            auVar52._8_4_ = 0x80000000;
            auVar52._0_8_ = 0x8000000080000000;
            auVar52._12_4_ = 0x80000000;
            auVar120 = vxorps_avx512vl(ZEXT416((uint)pfVar14[1]),auVar52);
            fVar215 = auVar120._0_4_ / fVar8;
            fVar189 = 0.0;
            if ((fVar215 <= fVar190) && (fVar189 = fVar190, fVar190 <= fVar215 + 1.0 / fVar8)) {
              auVar120 = vfmadd213ss_fma(ZEXT416((uint)fVar8),ZEXT416((uint)fVar190),
                                         ZEXT416((uint)pfVar14[1]));
              fVar189 = auVar120._0_4_ * fVar190;
            }
          }
        }
        *(float *)((long)pvVar13 + uVar102 * 4) = fVar189;
        uVar102 = uVar102 + 1;
      } while (uVar102 != (long)(int)uVar100);
    }
    else {
      iVar97 = 0;
      if ((iVar106 != 4) || (iVar97 = iVar98, (int)uVar100 < 1)) goto LAB_002a523f;
      uVar101 = 0;
      auVar191 = ZEXT816(0);
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar216._8_4_ = 0xc2b0c0a5;
      auVar216._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar216._12_4_ = 0xc2b0c0a5;
      auVar222._8_4_ = 0x3f000000;
      auVar222._0_8_ = 0x3f0000003f000000;
      auVar222._12_4_ = 0x3f000000;
      auVar228._8_4_ = 0x3fb8aa3b;
      auVar228._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar228._12_4_ = 0x3fb8aa3b;
      auVar232._8_4_ = 0x3f800000;
      auVar232._0_8_ = 0x3f8000003f800000;
      auVar232._12_4_ = 0x3f800000;
      auVar235._8_4_ = 0x3f318000;
      auVar235._0_8_ = 0x3f3180003f318000;
      auVar235._12_4_ = 0x3f318000;
      auVar244._8_4_ = 0x39506967;
      auVar244._0_8_ = 0x3950696739506967;
      auVar244._12_4_ = 0x39506967;
      auVar247._8_4_ = 0x3ab743ce;
      auVar247._0_8_ = 0x3ab743ce3ab743ce;
      auVar247._12_4_ = 0x3ab743ce;
      auVar250._8_4_ = 0x3c088908;
      auVar250._0_8_ = 0x3c0889083c088908;
      auVar250._12_4_ = 0x3c088908;
      auVar253._8_4_ = 0x3d2aa9c1;
      auVar253._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar253._12_4_ = 0x3d2aa9c1;
      auVar256._8_4_ = 0x3e2aaaaa;
      auVar256._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar256._12_4_ = 0x3e2aaaaa;
      auVar260._8_4_ = 0x3f800000;
      auVar260._0_8_ = 0x3f8000003f800000;
      auVar260._12_4_ = 0x3f800000;
      auVar262._8_4_ = 0xb95e8083;
      auVar262._0_8_ = 0xb95e8083b95e8083;
      auVar262._12_4_ = 0xb95e8083;
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar127 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      do {
        auVar132 = ZEXT816(0) << 0x40;
        if (lVar12 != 0) {
          auVar132 = *(undefined1 (*) [16])(lVar12 + uVar101 * 0x10);
        }
        pauVar108 = (undefined1 (*) [32])
                    ((long)(this->weight_data_tm).w * uVar101 * (this->weight_data_tm).elemsize +
                    (long)(this->weight_data_tm).data);
        auVar128 = in_ZMM17._0_16_;
        auVar130 = in_ZMM18._0_16_;
        auVar129 = in_ZMM16._0_16_;
        pauVar99 = local_f8;
        if ((int)uVar118 < 8) {
          auVar129 = vxorps_avx512vl(auVar129,auVar129);
          auVar147 = ZEXT1632(auVar129);
          auVar129 = vxorps_avx512vl(auVar130,auVar130);
          in_ZMM18 = ZEXT1664(auVar129);
          auVar129 = vxorps_avx512vl(auVar128,auVar128);
          in_ZMM17 = ZEXT1664(auVar129);
          auVar243 = ZEXT864(0);
          uVar100 = 0;
        }
        else {
          auVar243 = ZEXT864(0);
          iVar97 = 7;
          auVar128 = vxorps_avx512vl(auVar128,auVar128);
          in_ZMM17 = ZEXT1664(auVar128);
          auVar128 = vxorps_avx512vl(auVar130,auVar130);
          in_ZMM18 = ZEXT1664(auVar128);
          auVar129 = vxorps_avx512vl(auVar129,auVar129);
          auVar265 = ZEXT1664(auVar129);
          do {
            auVar129 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar99));
            auVar128 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar99 + 4)));
            auVar130 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar99 + 8)));
            auVar131 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar99 + 0xc)));
            auVar147 = vinsertf32x4_avx512vl(ZEXT1632(auVar129),auVar128,1);
            auVar148 = vinsertf32x4_avx512vl(ZEXT1632(auVar130),auVar131,1);
            auVar129 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar99 + 0x10)));
            auVar128 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar99 + 0x14)));
            auVar130 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar99 + 0x18)));
            auVar149 = vinsertf32x4_avx512vl(ZEXT1632(auVar129),auVar128,1);
            auVar129 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar99 + 0x1c)));
            auVar150 = vinsertf32x4_avx512vl(ZEXT1632(auVar130),auVar129,1);
            auVar147 = vfmadd231ps_avx512vl(auVar243._0_32_,auVar147,*pauVar108);
            auVar243 = ZEXT3264(auVar147);
            auVar147 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar148,pauVar108[1]);
            in_ZMM17 = ZEXT3264(auVar147);
            auVar147 = vfmadd231ps_avx512vl(in_ZMM18._0_32_,auVar149,pauVar108[2]);
            in_ZMM18 = ZEXT3264(auVar147);
            auVar147 = vfmadd231ps_avx512vl(auVar265._0_32_,auVar150,pauVar108[3]);
            auVar265 = ZEXT3264(auVar147);
            pauVar99 = pauVar99 + 1;
            pauVar108 = pauVar108 + 4;
            iVar97 = iVar97 + 8;
            uVar100 = uVar118 & 0xfffffff8;
          } while (iVar97 < (int)uVar118);
        }
        auVar148 = auVar243._0_32_;
        uVar114 = uVar100 | 3;
        while ((int)uVar114 < (int)uVar118) {
          auVar129 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar99));
          auVar128 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar99 + 4)));
          auVar130 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar99 + 8)));
          auVar131 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar99 + 0xc)));
          auVar148 = vinsertf32x4_avx512vl(ZEXT1632(auVar129),auVar128,1);
          auVar149 = vinsertf32x4_avx512vl(ZEXT1632(auVar130),auVar131,1);
          auVar148 = vfmadd231ps_avx512vl(auVar243._0_32_,auVar148,*pauVar108);
          auVar243 = ZEXT3264(auVar148);
          auVar149 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar149,pauVar108[1]);
          in_ZMM17 = ZEXT3264(auVar149);
          pauVar99 = (undefined1 (*) [32])(*pauVar99 + 0x10);
          pauVar108 = pauVar108 + 2;
          uVar114 = uVar100 + 7;
          uVar100 = uVar100 + 4;
        }
        if (uVar118 - uVar100 != 0 && (int)uVar100 <= (int)uVar118) {
          lVar112 = 0;
          do {
            auVar129 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar99 + lVar112 * 4)));
            auVar132 = vfmadd231ps_avx512vl(auVar132,auVar129,*(undefined1 (*) [16])*pauVar108);
            pauVar108 = (undefined1 (*) [32])(*pauVar108 + 0x10);
            lVar112 = lVar112 + 1;
          } while (uVar118 - uVar100 != (int)lVar112);
        }
        auVar147 = vaddps_avx512vl(in_ZMM18._0_32_,auVar147);
        auVar148 = vaddps_avx512vl(in_ZMM17._0_32_,auVar148);
        auVar147 = vaddps_avx512vl(auVar147,auVar148);
        auVar129 = vextractf32x4_avx512vl(auVar147,1);
        in_ZMM16 = ZEXT1664(auVar129);
        auVar129 = vaddps_avx512vl(auVar129,auVar147._0_16_);
        auVar138._0_4_ = auVar129._0_4_ + auVar132._0_4_;
        auVar138._4_4_ = auVar129._4_4_ + auVar132._4_4_;
        auVar138._8_4_ = auVar129._8_4_ + auVar132._8_4_;
        auVar138._12_4_ = auVar129._12_4_ + auVar132._12_4_;
        switch(uVar9) {
        case 1:
          auVar138 = vmaxps_avx(auVar138,auVar191);
          break;
        case 2:
          auVar132 = vmaxps_avx(auVar138,auVar191);
          auVar129 = vminps_avx(auVar138,auVar191);
          uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var10);
          auVar33._4_4_ = uVar7;
          auVar33._0_4_ = uVar7;
          auVar33._8_4_ = uVar7;
          auVar33._12_4_ = uVar7;
          auVar138 = vfmadd132ps_avx512vl(auVar129,auVar132,auVar33);
          break;
        case 3:
          uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var10);
          auVar31._4_4_ = uVar7;
          auVar31._0_4_ = uVar7;
          auVar31._8_4_ = uVar7;
          auVar31._12_4_ = uVar7;
          auVar132 = vmaxps_avx512vl(auVar138,auVar31);
          uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var10))[1];
          auVar32._4_4_ = uVar7;
          auVar32._0_4_ = uVar7;
          auVar32._8_4_ = uVar7;
          auVar32._12_4_ = uVar7;
          auVar138 = vminps_avx512vl(auVar132,auVar32);
          break;
        case 4:
          auVar29._8_4_ = 0x80000000;
          auVar29._0_8_ = 0x8000000080000000;
          auVar29._12_4_ = 0x80000000;
          auVar132 = vxorps_avx512vl(auVar138,auVar29);
          auVar132 = vminps_avx512vl(auVar132,auVar120);
          auVar132 = vmaxps_avx(auVar132,auVar216);
          auVar129 = vfmadd231ps_fma(auVar222,auVar132,auVar228);
          auVar128 = vcvttps2dq_avx512vl(auVar129);
          auVar128 = vcvtdq2ps_avx512vl(auVar128);
          uVar17 = vcmpps_avx512vl(auVar129,auVar128,1);
          auVar129 = vsubps_avx512vl(auVar128,auVar232);
          bVar15 = (bool)((byte)uVar17 & 1);
          auVar139._0_4_ = (uint)bVar15 * auVar129._0_4_ | (uint)!bVar15 * auVar128._0_4_;
          bVar15 = (bool)((byte)(uVar17 >> 1) & 1);
          auVar139._4_4_ = (uint)bVar15 * auVar129._4_4_ | (uint)!bVar15 * auVar128._4_4_;
          bVar15 = (bool)((byte)(uVar17 >> 2) & 1);
          auVar139._8_4_ = (uint)bVar15 * auVar129._8_4_ | (uint)!bVar15 * auVar128._8_4_;
          bVar15 = (bool)((byte)(uVar17 >> 3) & 1);
          auVar139._12_4_ = (uint)bVar15 * auVar129._12_4_ | (uint)!bVar15 * auVar128._12_4_;
          in_ZMM16 = ZEXT1664(auVar139);
          auVar132 = vfmsub231ps_avx512vl(auVar132,auVar139,auVar235);
          auVar30._8_4_ = 0x395e8083;
          auVar30._0_8_ = 0x395e8083395e8083;
          auVar30._12_4_ = 0x395e8083;
          auVar132 = vfmsub231ps_avx512vl(auVar132,auVar139,auVar30);
          auVar239._0_4_ = auVar132._0_4_ * auVar132._0_4_;
          auVar239._4_4_ = auVar132._4_4_ * auVar132._4_4_;
          auVar239._8_4_ = auVar132._8_4_ * auVar132._8_4_;
          auVar239._12_4_ = auVar132._12_4_ * auVar132._12_4_;
          auVar129 = vfmadd213ps_avx512vl(auVar244,auVar132,auVar247);
          auVar129 = vfmadd213ps_avx512vl(auVar129,auVar132,auVar250);
          auVar129 = vfmadd213ps_avx512vl(auVar129,auVar132,auVar253);
          auVar129 = vfmadd213ps_avx512vl(auVar129,auVar132,auVar256);
          auVar129 = vfmadd213ps_avx512vl(auVar129,auVar132,auVar222);
          auVar132 = vfmadd213ps_avx512vl(auVar129,auVar239,auVar132);
          in_ZMM17 = ZEXT1664(auVar132);
          auVar129 = vaddps_avx512vl(auVar132,auVar232);
          auVar132 = vcvttps2dq_avx512vl(auVar139);
          auVar132 = vpslld_avx(auVar132,0x17);
          auVar132 = vpaddd_avx(auVar260,auVar132);
          auVar129 = vfmadd213ps_fma(auVar132,auVar129,auVar232);
          auVar132 = vrcpps_avx(auVar129);
          auVar129 = vfmsub213ps_fma(auVar129,auVar132,auVar232);
          auVar138 = vfnmadd132ps_fma(auVar129,auVar132,auVar132);
          break;
        case 5:
          auVar132 = vminps_avx512vl(auVar138,auVar120);
          auVar132 = vmaxps_avx(auVar132,auVar216);
          auVar129 = vfmadd213ps_avx512vl(auVar228,auVar132,auVar222);
          auVar128 = vcvttps2dq_avx512vl(auVar129);
          auVar128 = vcvtdq2ps_avx512vl(auVar128);
          uVar17 = vcmpps_avx512vl(auVar129,auVar128,1);
          auVar129 = vsubps_avx512vl(auVar128,auVar232);
          bVar15 = (bool)((byte)uVar17 & 1);
          auVar133._0_4_ = (uint)bVar15 * auVar129._0_4_ | (uint)!bVar15 * auVar128._0_4_;
          bVar15 = (bool)((byte)(uVar17 >> 1) & 1);
          auVar133._4_4_ = (uint)bVar15 * auVar129._4_4_ | (uint)!bVar15 * auVar128._4_4_;
          bVar15 = (bool)((byte)(uVar17 >> 2) & 1);
          auVar133._8_4_ = (uint)bVar15 * auVar129._8_4_ | (uint)!bVar15 * auVar128._8_4_;
          bVar15 = (bool)((byte)(uVar17 >> 3) & 1);
          auVar133._12_4_ = (uint)bVar15 * auVar129._12_4_ | (uint)!bVar15 * auVar128._12_4_;
          auVar132 = vfmsub231ps_avx512vl(auVar132,auVar133,auVar235);
          auVar132 = vfnmsub231ps_avx512vl(auVar132,auVar133,auVar262);
          auVar129 = vmulps_avx512vl(auVar132,auVar132);
          auVar128 = vfmadd213ps_avx512vl(auVar244,auVar132,auVar247);
          auVar128 = vfmadd213ps_avx512vl(auVar128,auVar132,auVar250);
          auVar128 = vfmadd213ps_avx512vl(auVar128,auVar132,auVar253);
          auVar128 = vfmadd213ps_avx512vl(auVar128,auVar132,auVar256);
          auVar128 = vfmadd213ps_avx512vl(auVar128,auVar132,auVar222);
          auVar132 = vfmadd213ps_avx512vl(auVar128,auVar129,auVar132);
          auVar132 = vaddps_avx512vl(auVar132,auVar232);
          auVar129 = vcvttps2dq_avx512vl(auVar133);
          auVar129 = vpslld_avx512vl(auVar129,0x17);
          auVar129 = vpaddd_avx512vl(auVar129,auVar260);
          auVar132 = vfmadd213ps_avx512vl(auVar129,auVar132,auVar232);
          uVar17 = vcmpps_avx512vl(auVar132,auVar191,2);
          auVar21._8_4_ = 0x800000;
          auVar21._0_8_ = 0x80000000800000;
          auVar21._12_4_ = 0x800000;
          auVar132 = vmaxps_avx512vl(auVar132,auVar21);
          auVar129 = vpsrld_avx512vl(auVar132,0x17);
          auVar204._8_4_ = 0x807fffff;
          auVar204._0_8_ = 0x807fffff807fffff;
          auVar204._12_4_ = 0x807fffff;
          auVar22._8_4_ = 0x3f000000;
          auVar22._0_8_ = 0x3f0000003f000000;
          auVar22._12_4_ = 0x3f000000;
          auVar132 = vpternlogd_avx512vl(auVar132,auVar204,auVar22,0xea);
          auVar23._8_4_ = 0x3f3504f3;
          auVar23._0_8_ = 0x3f3504f33f3504f3;
          auVar23._12_4_ = 0x3f3504f3;
          uVar18 = vcmpps_avx512vl(auVar132,auVar23,1);
          auVar24._8_4_ = 0xbf800000;
          auVar24._0_8_ = 0xbf800000bf800000;
          auVar24._12_4_ = 0xbf800000;
          auVar128 = vaddps_avx512vl(auVar132,auVar24);
          auVar132 = vaddps_avx512vl(auVar128,auVar132);
          bVar15 = (bool)((byte)uVar18 & 1);
          auVar134._0_4_ = (uint)bVar15 * auVar132._0_4_ | (uint)!bVar15 * auVar128._0_4_;
          bVar15 = (bool)((byte)(uVar18 >> 1) & 1);
          auVar134._4_4_ = (uint)bVar15 * auVar132._4_4_ | (uint)!bVar15 * auVar128._4_4_;
          bVar15 = (bool)((byte)(uVar18 >> 2) & 1);
          auVar134._8_4_ = (uint)bVar15 * auVar132._8_4_ | (uint)!bVar15 * auVar128._8_4_;
          bVar15 = (bool)((byte)(uVar18 >> 3) & 1);
          auVar134._12_4_ = (uint)bVar15 * auVar132._12_4_ | (uint)!bVar15 * auVar128._12_4_;
          auVar132 = vmulps_avx512vl(auVar134,auVar134);
          auVar25._8_4_ = 0xbdebd1b8;
          auVar25._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar25._12_4_ = 0xbdebd1b8;
          auVar128 = vfmadd213ps_avx512vl(auVar121,auVar134,auVar25);
          auVar26._8_4_ = 0x3def251a;
          auVar26._0_8_ = 0x3def251a3def251a;
          auVar26._12_4_ = 0x3def251a;
          auVar128 = vfmadd213ps_avx512vl(auVar128,auVar134,auVar26);
          auVar27._8_4_ = 0xbdfe5d4f;
          auVar27._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar27._12_4_ = 0xbdfe5d4f;
          auVar128 = vfmadd213ps_avx512vl(auVar128,auVar134,auVar27);
          auVar128 = vfmadd213ps_avx512vl(auVar128,auVar134,auVar122);
          auVar128 = vfmadd213ps_avx512vl(auVar128,auVar134,auVar123);
          auVar128 = vfmadd213ps_avx512vl(auVar128,auVar134,auVar124);
          auVar128 = vfmadd213ps_avx512vl(auVar128,auVar134,auVar125);
          auVar128 = vfmadd213ps_avx512vl(auVar128,auVar134,auVar126);
          auVar130 = vmulps_avx512vl(auVar132,auVar134);
          auVar128 = vmulps_avx512vl(auVar130,auVar128);
          auVar28._8_4_ = 0xffffff82;
          auVar28._0_8_ = 0xffffff82ffffff82;
          auVar28._12_4_ = 0xffffff82;
          auVar129 = vpaddd_avx512vl(auVar129,auVar28);
          auVar129 = vcvtdq2ps_avx512vl(auVar129);
          auVar130 = vsubps_avx512vl(auVar129,auVar232);
          bVar15 = (bool)((byte)uVar18 & 1);
          auVar135._0_4_ = (uint)bVar15 * auVar130._0_4_ | (uint)!bVar15 * auVar129._0_4_;
          bVar15 = (bool)((byte)(uVar18 >> 1) & 1);
          auVar135._4_4_ = (uint)bVar15 * auVar130._4_4_ | (uint)!bVar15 * auVar129._4_4_;
          bVar15 = (bool)((byte)(uVar18 >> 2) & 1);
          auVar135._8_4_ = (uint)bVar15 * auVar130._8_4_ | (uint)!bVar15 * auVar129._8_4_;
          bVar15 = (bool)((byte)(uVar18 >> 3) & 1);
          auVar135._12_4_ = (uint)bVar15 * auVar130._12_4_ | (uint)!bVar15 * auVar129._12_4_;
          auVar129 = vfmadd231ps_avx512vl(auVar128,auVar135,auVar262);
          auVar132 = vfmsub231ps_avx512vl(auVar129,auVar222,auVar132);
          auVar132 = vsubps_avx512vl(auVar132,auVar134);
          auVar132 = vfnmadd231ps_avx512vl(auVar132,auVar235,auVar135);
          auVar129 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          bVar15 = (bool)((byte)uVar17 & 1);
          auVar136._0_4_ =
               (uint)bVar15 * auVar129._0_4_ |
               (uint)!bVar15 * (int)(auVar132._0_4_ + auVar132._0_4_);
          bVar15 = (bool)((byte)(uVar17 >> 1) & 1);
          auVar136._4_4_ =
               (uint)bVar15 * auVar129._4_4_ |
               (uint)!bVar15 * (int)(auVar132._4_4_ + auVar132._4_4_);
          bVar15 = (bool)((byte)(uVar17 >> 2) & 1);
          auVar136._8_4_ =
               (uint)bVar15 * auVar129._8_4_ |
               (uint)!bVar15 * (int)(auVar132._8_4_ + auVar132._8_4_);
          bVar15 = (bool)((byte)(uVar17 >> 3) & 1);
          auVar136._12_4_ =
               (uint)bVar15 * auVar129._12_4_ |
               (uint)!bVar15 * (int)(auVar132._12_4_ + auVar132._12_4_);
          auVar132 = vminps_avx512vl(auVar136,auVar120);
          auVar132 = vmaxps_avx(auVar132,auVar216);
          auVar129 = vfmadd213ps_avx512vl(auVar228,auVar132,auVar222);
          auVar128 = vcvttps2dq_avx512vl(auVar129);
          auVar128 = vcvtdq2ps_avx512vl(auVar128);
          uVar17 = vcmpps_avx512vl(auVar129,auVar128,1);
          auVar129 = vsubps_avx512vl(auVar128,auVar232);
          bVar15 = (bool)((byte)uVar17 & 1);
          auVar137._0_4_ = (uint)bVar15 * auVar129._0_4_ | (uint)!bVar15 * auVar128._0_4_;
          bVar15 = (bool)((byte)(uVar17 >> 1) & 1);
          auVar137._4_4_ = (uint)bVar15 * auVar129._4_4_ | (uint)!bVar15 * auVar128._4_4_;
          bVar15 = (bool)((byte)(uVar17 >> 2) & 1);
          auVar137._8_4_ = (uint)bVar15 * auVar129._8_4_ | (uint)!bVar15 * auVar128._8_4_;
          bVar15 = (bool)((byte)(uVar17 >> 3) & 1);
          auVar137._12_4_ = (uint)bVar15 * auVar129._12_4_ | (uint)!bVar15 * auVar128._12_4_;
          in_ZMM17 = ZEXT1664(auVar137);
          auVar132 = vfmsub231ps_avx512vl(auVar132,auVar137,auVar235);
          auVar132 = vfnmsub231ps_avx512vl(auVar132,auVar137,auVar262);
          auVar129 = vmulps_avx512vl(auVar132,auVar132);
          auVar128 = vfmadd213ps_avx512vl(auVar244,auVar132,auVar247);
          auVar128 = vfmadd213ps_avx512vl(auVar128,auVar132,auVar250);
          auVar128 = vfmadd213ps_avx512vl(auVar128,auVar132,auVar253);
          auVar128 = vfmadd213ps_avx512vl(auVar128,auVar132,auVar256);
          auVar128 = vfmadd213ps_avx512vl(auVar128,auVar132,auVar222);
          auVar132 = vfmadd213ps_avx512vl(auVar128,auVar129,auVar132);
          in_ZMM18 = ZEXT1664(auVar132);
          auVar132 = vaddps_avx512vl(auVar132,auVar232);
          auVar129 = vcvttps2dq_avx512vl(auVar137);
          auVar129 = vpslld_avx512vl(auVar129,0x17);
          auVar129 = vpaddd_avx512vl(auVar129,auVar260);
          auVar129 = vfmadd213ps_fma(auVar129,auVar132,auVar232);
          auVar132 = vrcpps_avx(auVar129);
          auVar128 = vaddps_avx512vl(auVar132,auVar132);
          in_ZMM16 = ZEXT1664(auVar128);
          auVar129 = vfmsub213ps_avx512vl(auVar129,auVar128,auVar127);
          auVar132 = vfnmadd213ps_avx512vl(auVar129,auVar132,auVar128);
          auVar138 = vfmsub231ps_fma(auVar138,auVar138,auVar132);
          break;
        case 6:
          uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var10);
          auVar205._4_4_ = uVar7;
          auVar205._0_4_ = uVar7;
          auVar205._8_4_ = uVar7;
          auVar205._12_4_ = uVar7;
          uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var10))[1];
          auVar20._4_4_ = uVar7;
          auVar20._0_4_ = uVar7;
          auVar20._8_4_ = uVar7;
          auVar20._12_4_ = uVar7;
          auVar132 = vfmadd213ps_avx512vl(auVar205,auVar138,auVar20);
          auVar132 = vmaxps_avx(auVar132,auVar191);
          auVar132 = vminps_avx(auVar132,auVar232);
          auVar138._0_4_ = auVar132._0_4_ * auVar138._0_4_;
          auVar138._4_4_ = auVar132._4_4_ * auVar138._4_4_;
          auVar138._8_4_ = auVar132._8_4_ * auVar138._8_4_;
          auVar138._12_4_ = auVar132._12_4_ * auVar138._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar101 * 0x10) = auVar138;
        uVar101 = uVar101 + 1;
      } while (uVar101 != uVar102);
    }
  }
  else if (iVar106 == 8) {
    if ((int)uVar100 < 1) goto LAB_002a523f;
    uVar101 = 0;
    auVar147 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
    auVar153._8_4_ = 0xc2b0c0a5;
    auVar153._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar153._12_4_ = 0xc2b0c0a5;
    auVar153._16_4_ = 0xc2b0c0a5;
    auVar153._20_4_ = 0xc2b0c0a5;
    auVar153._24_4_ = 0xc2b0c0a5;
    auVar153._28_4_ = 0xc2b0c0a5;
    auVar154._8_4_ = 0x3f000000;
    auVar154._0_8_ = 0x3f0000003f000000;
    auVar154._12_4_ = 0x3f000000;
    auVar154._16_4_ = 0x3f000000;
    auVar154._20_4_ = 0x3f000000;
    auVar154._24_4_ = 0x3f000000;
    auVar154._28_4_ = 0x3f000000;
    auVar155._8_4_ = 0x3fb8aa3b;
    auVar155._0_8_ = 0x3fb8aa3b3fb8aa3b;
    auVar155._12_4_ = 0x3fb8aa3b;
    auVar155._16_4_ = 0x3fb8aa3b;
    auVar155._20_4_ = 0x3fb8aa3b;
    auVar155._24_4_ = 0x3fb8aa3b;
    auVar155._28_4_ = 0x3fb8aa3b;
    auVar156._8_4_ = 0x3f800000;
    auVar156._0_8_ = 0x3f8000003f800000;
    auVar156._12_4_ = 0x3f800000;
    auVar156._16_4_ = 0x3f800000;
    auVar156._20_4_ = 0x3f800000;
    auVar156._24_4_ = 0x3f800000;
    auVar156._28_4_ = 0x3f800000;
    auVar157._8_4_ = 0x3f318000;
    auVar157._0_8_ = 0x3f3180003f318000;
    auVar157._12_4_ = 0x3f318000;
    auVar157._16_4_ = 0x3f318000;
    auVar157._20_4_ = 0x3f318000;
    auVar157._24_4_ = 0x3f318000;
    auVar157._28_4_ = 0x3f318000;
    auVar158._8_4_ = 0x39506967;
    auVar158._0_8_ = 0x3950696739506967;
    auVar158._12_4_ = 0x39506967;
    auVar158._16_4_ = 0x39506967;
    auVar158._20_4_ = 0x39506967;
    auVar158._24_4_ = 0x39506967;
    auVar158._28_4_ = 0x39506967;
    auVar159._8_4_ = 0x3ab743ce;
    auVar159._0_8_ = 0x3ab743ce3ab743ce;
    auVar159._12_4_ = 0x3ab743ce;
    auVar159._16_4_ = 0x3ab743ce;
    auVar159._20_4_ = 0x3ab743ce;
    auVar159._24_4_ = 0x3ab743ce;
    auVar159._28_4_ = 0x3ab743ce;
    auVar168._8_4_ = 0x3c088908;
    auVar168._0_8_ = 0x3c0889083c088908;
    auVar168._12_4_ = 0x3c088908;
    auVar168._16_4_ = 0x3c088908;
    auVar168._20_4_ = 0x3c088908;
    auVar168._24_4_ = 0x3c088908;
    auVar168._28_4_ = 0x3c088908;
    auVar160._8_4_ = 0x3d2aa9c1;
    auVar160._0_8_ = 0x3d2aa9c13d2aa9c1;
    auVar160._12_4_ = 0x3d2aa9c1;
    auVar160._16_4_ = 0x3d2aa9c1;
    auVar160._20_4_ = 0x3d2aa9c1;
    auVar160._24_4_ = 0x3d2aa9c1;
    auVar160._28_4_ = 0x3d2aa9c1;
    auVar161._8_4_ = 0x3e2aaaaa;
    auVar161._0_8_ = 0x3e2aaaaa3e2aaaaa;
    auVar161._12_4_ = 0x3e2aaaaa;
    auVar161._16_4_ = 0x3e2aaaaa;
    auVar161._20_4_ = 0x3e2aaaaa;
    auVar161._24_4_ = 0x3e2aaaaa;
    auVar161._28_4_ = 0x3e2aaaaa;
    auVar162._8_4_ = 0x3f800000;
    auVar162._0_8_ = 0x3f8000003f800000;
    auVar162._12_4_ = 0x3f800000;
    auVar162._16_4_ = 0x3f800000;
    auVar162._20_4_ = 0x3f800000;
    auVar162._24_4_ = 0x3f800000;
    auVar162._28_4_ = 0x3f800000;
    auVar163._8_4_ = 0xb95e8083;
    auVar163._0_8_ = 0xb95e8083b95e8083;
    auVar163._12_4_ = 0xb95e8083;
    auVar163._16_4_ = 0xb95e8083;
    auVar163._20_4_ = 0xb95e8083;
    auVar163._24_4_ = 0xb95e8083;
    auVar163._28_4_ = 0xb95e8083;
    auVar148 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
    auVar149 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
    auVar150 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
    auVar151 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
    auVar152 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
    do {
      auVar243 = ZEXT1664(ZEXT816(0) << 0x40);
      if (lVar12 != 0) {
        auVar243 = ZEXT3264(*(undefined1 (*) [32])(lVar12 + uVar101 * 0x20));
      }
      pauVar108 = (undefined1 (*) [32])
                  ((long)(this->weight_data_tm).w * uVar101 * (this->weight_data_tm).elemsize +
                  (long)(this->weight_data_tm).data);
      auVar121 = in_ZMM17._0_16_;
      auVar120 = in_ZMM16._0_16_;
      auVar124 = in_ZMM20._0_16_;
      auVar123 = in_ZMM19._0_16_;
      auVar125 = in_ZMM23._0_16_;
      auVar122 = in_ZMM18._0_16_;
      pauVar99 = local_f8;
      if ((int)uVar118 < 8) {
        auVar122 = vxorps_avx512vl(auVar122,auVar122);
        auVar165 = ZEXT1632(auVar122);
        auVar122 = vxorps_avx512vl(auVar125,auVar125);
        in_ZMM23 = ZEXT1664(auVar122);
        auVar122 = vxorps_avx512vl(auVar123,auVar123);
        auVar164 = ZEXT1632(auVar122);
        auVar122 = vxorps_avx512vl(auVar124,auVar124);
        in_ZMM20 = ZEXT1664(auVar122);
        auVar120 = vxorps_avx512vl(auVar120,auVar120);
        auVar214 = ZEXT1664(auVar120);
        auVar120 = vxorps_avx512vl(auVar121,auVar121);
        in_ZMM17 = ZEXT1664(auVar120);
        auVar265 = ZEXT864(0);
        uVar100 = 0;
      }
      else {
        auVar265 = ZEXT864(0);
        iVar97 = 7;
        auVar121 = vxorps_avx512vl(auVar121,auVar121);
        in_ZMM17 = ZEXT1664(auVar121);
        auVar120 = vxorps_avx512vl(auVar120,auVar120);
        auVar214 = ZEXT1664(auVar120);
        auVar120 = vxorps_avx512vl(auVar124,auVar124);
        in_ZMM20 = ZEXT1664(auVar120);
        auVar120 = vxorps_avx512vl(auVar123,auVar123);
        auVar238 = ZEXT1664(auVar120);
        auVar120 = vxorps_avx512vl(auVar125,auVar125);
        in_ZMM23 = ZEXT1664(auVar120);
        auVar120 = vxorps_avx512vl(auVar122,auVar122);
        auVar227 = ZEXT1664(auVar120);
        do {
          auVar164 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar99));
          auVar165 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar99 + 4)));
          auVar166 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar99 + 8)));
          auVar167 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar99 + 0xc)));
          auVar164 = vfmadd231ps_avx512vl(auVar243._0_32_,auVar164,*pauVar108);
          auVar243 = ZEXT3264(auVar164);
          auVar164 = vfmadd231ps_avx512vl(auVar265._0_32_,auVar165,pauVar108[1]);
          auVar265 = ZEXT3264(auVar164);
          auVar164 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar166,pauVar108[2]);
          in_ZMM17 = ZEXT3264(auVar164);
          auVar164 = vfmadd231ps_avx512vl(auVar214._0_32_,auVar167,pauVar108[3]);
          auVar214 = ZEXT3264(auVar164);
          auVar164 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar99 + 0x10)));
          auVar165 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar99 + 0x14)));
          auVar166 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar99 + 0x18)));
          auVar167 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar99 + 0x1c)));
          auVar164 = vfmadd231ps_avx512vl(in_ZMM20._0_32_,auVar164,pauVar108[4]);
          in_ZMM20 = ZEXT3264(auVar164);
          auVar164 = vfmadd231ps_avx512vl(auVar238._0_32_,auVar165,pauVar108[5]);
          auVar238 = ZEXT3264(auVar164);
          auVar165 = vfmadd231ps_avx512vl(in_ZMM23._0_32_,auVar166,pauVar108[6]);
          in_ZMM23 = ZEXT3264(auVar165);
          auVar165 = vfmadd231ps_avx512vl(auVar227._0_32_,auVar167,pauVar108[7]);
          auVar227 = ZEXT3264(auVar165);
          pauVar99 = pauVar99 + 1;
          pauVar108 = pauVar108 + 8;
          iVar97 = iVar97 + 8;
          uVar100 = uVar118 & 0xfffffff8;
        } while (iVar97 < (int)uVar118);
      }
      auVar167 = auVar265._0_32_;
      auVar166 = auVar214._0_32_;
      uVar114 = uVar100 | 3;
      while( true ) {
        auVar178 = auVar243._0_32_;
        if ((int)uVar118 <= (int)uVar114) break;
        auVar166 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar99));
        auVar167 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar99 + 4)));
        auVar176 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar99 + 8)));
        auVar177 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar99 + 0xc)));
        auVar166 = vfmadd231ps_avx512vl(auVar178,auVar166,*pauVar108);
        auVar243 = ZEXT3264(auVar166);
        auVar167 = vfmadd231ps_avx512vl(auVar265._0_32_,auVar167,pauVar108[1]);
        auVar265 = ZEXT3264(auVar167);
        auVar166 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar176,pauVar108[2]);
        in_ZMM17 = ZEXT3264(auVar166);
        auVar166 = vfmadd231ps_avx512vl(auVar214._0_32_,auVar177,pauVar108[3]);
        auVar214 = ZEXT3264(auVar166);
        pauVar99 = (undefined1 (*) [32])(*pauVar99 + 0x10);
        pauVar108 = pauVar108 + 4;
        uVar114 = uVar100 + 7;
        uVar100 = uVar100 + 4;
      }
      if (uVar118 - uVar100 != 0 && (int)uVar100 <= (int)uVar118) {
        lVar112 = 0;
        do {
          auVar178 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar99 + lVar112 * 4)));
          auVar178 = vfmadd231ps_avx512vl(auVar243._0_32_,auVar178,*pauVar108);
          auVar243 = ZEXT3264(auVar178);
          pauVar108 = pauVar108 + 1;
          lVar112 = lVar112 + 1;
        } while (uVar118 - uVar100 != (int)lVar112);
      }
      auVar165 = vaddps_avx512vl(in_ZMM23._0_32_,auVar165);
      auVar164 = vaddps_avx512vl(auVar164,in_ZMM20._0_32_);
      in_ZMM19 = ZEXT3264(auVar164);
      auVar164 = vaddps_avx512vl(auVar165,auVar164);
      in_ZMM18 = ZEXT3264(auVar164);
      auVar165 = vaddps_avx512vl(auVar166,in_ZMM17._0_32_);
      in_ZMM16 = ZEXT3264(auVar165);
      auVar165 = vaddps_avx512vl(auVar165,auVar167);
      auVar165 = vaddps_avx512vl(auVar164,auVar165);
      auVar164._0_4_ = auVar165._0_4_ + auVar178._0_4_;
      auVar164._4_4_ = auVar165._4_4_ + auVar178._4_4_;
      auVar164._8_4_ = auVar165._8_4_ + auVar178._8_4_;
      auVar164._12_4_ = auVar165._12_4_ + auVar178._12_4_;
      auVar164._16_4_ = auVar165._16_4_ + auVar178._16_4_;
      auVar164._20_4_ = auVar165._20_4_ + auVar178._20_4_;
      auVar164._24_4_ = auVar165._24_4_ + auVar178._24_4_;
      auVar164._28_4_ = auVar165._28_4_ + auVar178._28_4_;
      if (5 < uVar9 - 1) goto LAB_002a5222;
      auVar165 = ZEXT1632(ZEXT816(0));
      switch(uVar9) {
      case 1:
        auVar164 = vmaxps_avx(auVar164,ZEXT1632(ZEXT816(0)));
        break;
      case 2:
        auVar166 = vmaxps_avx(auVar164,auVar165);
        auVar164 = vminps_avx(auVar164,auVar165);
        uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var10);
        auVar78._4_4_ = uVar7;
        auVar78._0_4_ = uVar7;
        auVar78._8_4_ = uVar7;
        auVar78._12_4_ = uVar7;
        auVar78._16_4_ = uVar7;
        auVar78._20_4_ = uVar7;
        auVar78._24_4_ = uVar7;
        auVar78._28_4_ = uVar7;
        auVar164 = vfmadd132ps_avx512vl(auVar164,auVar166,auVar78);
        break;
      case 3:
        uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var10);
        auVar76._4_4_ = uVar7;
        auVar76._0_4_ = uVar7;
        auVar76._8_4_ = uVar7;
        auVar76._12_4_ = uVar7;
        auVar76._16_4_ = uVar7;
        auVar76._20_4_ = uVar7;
        auVar76._24_4_ = uVar7;
        auVar76._28_4_ = uVar7;
        auVar164 = vmaxps_avx512vl(auVar164,auVar76);
        uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var10))[1];
        auVar77._4_4_ = uVar7;
        auVar77._0_4_ = uVar7;
        auVar77._8_4_ = uVar7;
        auVar77._12_4_ = uVar7;
        auVar77._16_4_ = uVar7;
        auVar77._20_4_ = uVar7;
        auVar77._24_4_ = uVar7;
        auVar77._28_4_ = uVar7;
        auVar164 = vminps_avx512vl(auVar164,auVar77);
        break;
      case 4:
        auVar74._8_4_ = 0x80000000;
        auVar74._0_8_ = 0x8000000080000000;
        auVar74._12_4_ = 0x80000000;
        auVar74._16_4_ = 0x80000000;
        auVar74._20_4_ = 0x80000000;
        auVar74._24_4_ = 0x80000000;
        auVar74._28_4_ = 0x80000000;
        auVar164 = vxorps_avx512vl(auVar164,auVar74);
        auVar164 = vminps_avx512vl(auVar164,auVar147);
        auVar164 = vmaxps_avx(auVar164,auVar153);
        auVar120 = vfmadd231ps_fma(auVar154,auVar164,auVar155);
        auVar165 = vrndscaleps_avx512vl(ZEXT1632(auVar120),1);
        uVar17 = vcmpps_avx512vl(ZEXT1632(auVar120),auVar165,1);
        auVar166 = vsubps_avx512vl(auVar165,auVar156);
        bVar15 = (bool)((byte)uVar17 & 1);
        auVar184._0_4_ = (uint)bVar15 * auVar166._0_4_ | (uint)!bVar15 * auVar165._0_4_;
        bVar15 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar184._4_4_ = (uint)bVar15 * auVar166._4_4_ | (uint)!bVar15 * auVar165._4_4_;
        bVar15 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar184._8_4_ = (uint)bVar15 * auVar166._8_4_ | (uint)!bVar15 * auVar165._8_4_;
        bVar15 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar184._12_4_ = (uint)bVar15 * auVar166._12_4_ | (uint)!bVar15 * auVar165._12_4_;
        bVar15 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar184._16_4_ = (uint)bVar15 * auVar166._16_4_ | (uint)!bVar15 * auVar165._16_4_;
        bVar15 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar184._20_4_ = (uint)bVar15 * auVar166._20_4_ | (uint)!bVar15 * auVar165._20_4_;
        bVar15 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar184._24_4_ = (uint)bVar15 * auVar166._24_4_ | (uint)!bVar15 * auVar165._24_4_;
        bVar15 = SUB81(uVar17 >> 7,0);
        auVar184._28_4_ = (uint)bVar15 * auVar166._28_4_ | (uint)!bVar15 * auVar165._28_4_;
        in_ZMM16 = ZEXT3264(auVar184);
        auVar164 = vfmsub231ps_avx512vl(auVar164,auVar184,auVar157);
        auVar75._8_4_ = 0x395e8083;
        auVar75._0_8_ = 0x395e8083395e8083;
        auVar75._12_4_ = 0x395e8083;
        auVar75._16_4_ = 0x395e8083;
        auVar75._20_4_ = 0x395e8083;
        auVar75._24_4_ = 0x395e8083;
        auVar75._28_4_ = 0x395e8083;
        auVar164 = vfmsub231ps_avx512vl(auVar164,auVar184,auVar75);
        auVar242._0_4_ = auVar164._0_4_ * auVar164._0_4_;
        auVar242._4_4_ = auVar164._4_4_ * auVar164._4_4_;
        auVar242._8_4_ = auVar164._8_4_ * auVar164._8_4_;
        auVar242._12_4_ = auVar164._12_4_ * auVar164._12_4_;
        auVar242._16_4_ = auVar164._16_4_ * auVar164._16_4_;
        auVar242._20_4_ = auVar164._20_4_ * auVar164._20_4_;
        auVar242._24_4_ = auVar164._24_4_ * auVar164._24_4_;
        auVar242._28_4_ = 0;
        auVar165 = vfmadd213ps_avx512vl(auVar158,auVar164,auVar159);
        auVar165 = vfmadd213ps_avx512vl(auVar165,auVar164,auVar168);
        auVar165 = vfmadd213ps_avx512vl(auVar165,auVar164,auVar160);
        auVar165 = vfmadd213ps_avx512vl(auVar165,auVar164,auVar161);
        auVar165 = vfmadd213ps_avx512vl(auVar165,auVar164,auVar154);
        auVar164 = vfmadd213ps_avx512vl(auVar165,auVar242,auVar164);
        in_ZMM17 = ZEXT3264(auVar164);
        auVar165 = vaddps_avx512vl(auVar164,auVar156);
        auVar164 = vcvttps2dq_avx512vl(auVar184);
        auVar164 = vpslld_avx2(auVar164,0x17);
        auVar164 = vpaddd_avx2(auVar162,auVar164);
        auVar120 = vfmadd213ps_fma(auVar164,auVar165,auVar156);
        auVar164 = vrcpps_avx(ZEXT1632(auVar120));
        auVar120 = vfmsub213ps_fma(ZEXT1632(auVar120),auVar164,auVar156);
        auVar120 = vfnmadd132ps_fma(ZEXT1632(auVar120),auVar164,auVar164);
        auVar164 = ZEXT1632(auVar120);
        break;
      case 5:
        auVar166 = vminps_avx512vl(auVar164,auVar147);
        auVar166 = vmaxps_avx(auVar166,auVar153);
        auVar167 = vfmadd213ps_avx512vl(auVar155,auVar166,auVar154);
        auVar178 = vrndscaleps_avx512vl(auVar167,1);
        uVar17 = vcmpps_avx512vl(auVar167,auVar178,1);
        auVar167 = vsubps_avx512vl(auVar178,auVar156);
        bVar15 = (bool)((byte)uVar17 & 1);
        auVar179._0_4_ = (uint)bVar15 * auVar167._0_4_ | (uint)!bVar15 * auVar178._0_4_;
        bVar15 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar179._4_4_ = (uint)bVar15 * auVar167._4_4_ | (uint)!bVar15 * auVar178._4_4_;
        bVar15 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar179._8_4_ = (uint)bVar15 * auVar167._8_4_ | (uint)!bVar15 * auVar178._8_4_;
        bVar15 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar179._12_4_ = (uint)bVar15 * auVar167._12_4_ | (uint)!bVar15 * auVar178._12_4_;
        bVar15 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar179._16_4_ = (uint)bVar15 * auVar167._16_4_ | (uint)!bVar15 * auVar178._16_4_;
        bVar15 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar179._20_4_ = (uint)bVar15 * auVar167._20_4_ | (uint)!bVar15 * auVar178._20_4_;
        bVar15 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar179._24_4_ = (uint)bVar15 * auVar167._24_4_ | (uint)!bVar15 * auVar178._24_4_;
        bVar15 = SUB81(uVar17 >> 7,0);
        auVar179._28_4_ = (uint)bVar15 * auVar167._28_4_ | (uint)!bVar15 * auVar178._28_4_;
        auVar166 = vfmsub231ps_avx512vl(auVar166,auVar179,auVar157);
        auVar166 = vfnmsub231ps_avx512vl(auVar166,auVar179,auVar163);
        auVar167 = vmulps_avx512vl(auVar166,auVar166);
        auVar178 = vfmadd213ps_avx512vl(auVar158,auVar166,auVar159);
        auVar178 = vfmadd213ps_avx512vl(auVar178,auVar166,auVar168);
        auVar178 = vfmadd213ps_avx512vl(auVar178,auVar166,auVar160);
        auVar178 = vfmadd213ps_avx512vl(auVar178,auVar166,auVar161);
        auVar178 = vfmadd213ps_avx512vl(auVar178,auVar166,auVar154);
        auVar166 = vfmadd213ps_avx512vl(auVar178,auVar167,auVar166);
        auVar166 = vaddps_avx512vl(auVar166,auVar156);
        auVar167 = vcvttps2dq_avx512vl(auVar179);
        auVar167 = vpslld_avx512vl(auVar167,0x17);
        auVar167 = vpaddd_avx512vl(auVar167,auVar162);
        auVar166 = vfmadd213ps_avx512vl(auVar167,auVar166,auVar156);
        uVar17 = vcmpps_avx512vl(auVar166,auVar165,2);
        auVar165._8_4_ = 0x800000;
        auVar165._0_8_ = 0x80000000800000;
        auVar165._12_4_ = 0x800000;
        auVar165._16_4_ = 0x800000;
        auVar165._20_4_ = 0x800000;
        auVar165._24_4_ = 0x800000;
        auVar165._28_4_ = 0x800000;
        auVar165 = vmaxps_avx512vl(auVar166,auVar165);
        auVar166 = vpsrld_avx512vl(auVar165,0x17);
        auVar213._8_4_ = 0x807fffff;
        auVar213._0_8_ = 0x807fffff807fffff;
        auVar213._12_4_ = 0x807fffff;
        auVar213._16_4_ = 0x807fffff;
        auVar213._20_4_ = 0x807fffff;
        auVar213._24_4_ = 0x807fffff;
        auVar213._28_4_ = 0x807fffff;
        auVar178._8_4_ = 0x3f000000;
        auVar178._0_8_ = 0x3f0000003f000000;
        auVar178._12_4_ = 0x3f000000;
        auVar178._16_4_ = 0x3f000000;
        auVar178._20_4_ = 0x3f000000;
        auVar178._24_4_ = 0x3f000000;
        auVar178._28_4_ = 0x3f000000;
        auVar165 = vpternlogd_avx512vl(auVar165,auVar213,auVar178,0xea);
        auVar176._8_4_ = 0x3f3504f3;
        auVar176._0_8_ = 0x3f3504f33f3504f3;
        auVar176._12_4_ = 0x3f3504f3;
        auVar176._16_4_ = 0x3f3504f3;
        auVar176._20_4_ = 0x3f3504f3;
        auVar176._24_4_ = 0x3f3504f3;
        auVar176._28_4_ = 0x3f3504f3;
        uVar18 = vcmpps_avx512vl(auVar165,auVar176,1);
        auVar167 = vaddps_avx512vl(auVar165,auVar148);
        auVar165 = vaddps_avx512vl(auVar167,auVar165);
        bVar15 = (bool)((byte)uVar18 & 1);
        auVar180._0_4_ = (uint)bVar15 * auVar165._0_4_ | (uint)!bVar15 * auVar167._0_4_;
        bVar15 = (bool)((byte)(uVar18 >> 1) & 1);
        auVar180._4_4_ = (uint)bVar15 * auVar165._4_4_ | (uint)!bVar15 * auVar167._4_4_;
        bVar15 = (bool)((byte)(uVar18 >> 2) & 1);
        auVar180._8_4_ = (uint)bVar15 * auVar165._8_4_ | (uint)!bVar15 * auVar167._8_4_;
        bVar15 = (bool)((byte)(uVar18 >> 3) & 1);
        auVar180._12_4_ = (uint)bVar15 * auVar165._12_4_ | (uint)!bVar15 * auVar167._12_4_;
        bVar15 = (bool)((byte)(uVar18 >> 4) & 1);
        auVar180._16_4_ = (uint)bVar15 * auVar165._16_4_ | (uint)!bVar15 * auVar167._16_4_;
        bVar15 = (bool)((byte)(uVar18 >> 5) & 1);
        auVar180._20_4_ = (uint)bVar15 * auVar165._20_4_ | (uint)!bVar15 * auVar167._20_4_;
        bVar15 = (bool)((byte)(uVar18 >> 6) & 1);
        auVar180._24_4_ = (uint)bVar15 * auVar165._24_4_ | (uint)!bVar15 * auVar167._24_4_;
        bVar15 = SUB81(uVar18 >> 7,0);
        auVar180._28_4_ = (uint)bVar15 * auVar165._28_4_ | (uint)!bVar15 * auVar167._28_4_;
        auVar165 = vmulps_avx512vl(auVar180,auVar180);
        auVar167 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar177._8_4_ = 0xbdebd1b8;
        auVar177._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar177._12_4_ = 0xbdebd1b8;
        auVar177._16_4_ = 0xbdebd1b8;
        auVar177._20_4_ = 0xbdebd1b8;
        auVar177._24_4_ = 0xbdebd1b8;
        auVar177._28_4_ = 0xbdebd1b8;
        auVar167 = vfmadd213ps_avx512vl(auVar167,auVar180,auVar177);
        auVar69._8_4_ = 0x3def251a;
        auVar69._0_8_ = 0x3def251a3def251a;
        auVar69._12_4_ = 0x3def251a;
        auVar69._16_4_ = 0x3def251a;
        auVar69._20_4_ = 0x3def251a;
        auVar69._24_4_ = 0x3def251a;
        auVar69._28_4_ = 0x3def251a;
        auVar167 = vfmadd213ps_avx512vl(auVar167,auVar180,auVar69);
        auVar70._8_4_ = 0xbdfe5d4f;
        auVar70._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar70._12_4_ = 0xbdfe5d4f;
        auVar70._16_4_ = 0xbdfe5d4f;
        auVar70._20_4_ = 0xbdfe5d4f;
        auVar70._24_4_ = 0xbdfe5d4f;
        auVar70._28_4_ = 0xbdfe5d4f;
        auVar167 = vfmadd213ps_avx512vl(auVar167,auVar180,auVar70);
        auVar71._8_4_ = 0x3e11e9bf;
        auVar71._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar71._12_4_ = 0x3e11e9bf;
        auVar71._16_4_ = 0x3e11e9bf;
        auVar71._20_4_ = 0x3e11e9bf;
        auVar71._24_4_ = 0x3e11e9bf;
        auVar71._28_4_ = 0x3e11e9bf;
        auVar167 = vfmadd213ps_avx512vl(auVar167,auVar180,auVar71);
        auVar72._8_4_ = 0xbe2aae50;
        auVar72._0_8_ = 0xbe2aae50be2aae50;
        auVar72._12_4_ = 0xbe2aae50;
        auVar72._16_4_ = 0xbe2aae50;
        auVar72._20_4_ = 0xbe2aae50;
        auVar72._24_4_ = 0xbe2aae50;
        auVar72._28_4_ = 0xbe2aae50;
        auVar167 = vfmadd213ps_avx512vl(auVar167,auVar180,auVar72);
        auVar167 = vfmadd213ps_avx512vl(auVar167,auVar180,auVar149);
        auVar167 = vfmadd213ps_avx512vl(auVar167,auVar180,auVar150);
        auVar167 = vfmadd213ps_avx512vl(auVar167,auVar180,auVar151);
        auVar178 = vmulps_avx512vl(auVar165,auVar180);
        in_ZMM19 = ZEXT3264(auVar178);
        auVar167 = vmulps_avx512vl(auVar178,auVar167);
        auVar73._8_4_ = 0xffffff82;
        auVar73._0_8_ = 0xffffff82ffffff82;
        auVar73._12_4_ = 0xffffff82;
        auVar73._16_4_ = 0xffffff82;
        auVar73._20_4_ = 0xffffff82;
        auVar73._24_4_ = 0xffffff82;
        auVar73._28_4_ = 0xffffff82;
        auVar166 = vpaddd_avx512vl(auVar166,auVar73);
        auVar166 = vcvtdq2ps_avx512vl(auVar166);
        auVar178 = vsubps_avx512vl(auVar166,auVar156);
        bVar15 = (bool)((byte)uVar18 & 1);
        auVar181._0_4_ = (uint)bVar15 * auVar178._0_4_ | (uint)!bVar15 * auVar166._0_4_;
        bVar15 = (bool)((byte)(uVar18 >> 1) & 1);
        auVar181._4_4_ = (uint)bVar15 * auVar178._4_4_ | (uint)!bVar15 * auVar166._4_4_;
        bVar15 = (bool)((byte)(uVar18 >> 2) & 1);
        auVar181._8_4_ = (uint)bVar15 * auVar178._8_4_ | (uint)!bVar15 * auVar166._8_4_;
        bVar15 = (bool)((byte)(uVar18 >> 3) & 1);
        auVar181._12_4_ = (uint)bVar15 * auVar178._12_4_ | (uint)!bVar15 * auVar166._12_4_;
        bVar15 = (bool)((byte)(uVar18 >> 4) & 1);
        auVar181._16_4_ = (uint)bVar15 * auVar178._16_4_ | (uint)!bVar15 * auVar166._16_4_;
        bVar15 = (bool)((byte)(uVar18 >> 5) & 1);
        auVar181._20_4_ = (uint)bVar15 * auVar178._20_4_ | (uint)!bVar15 * auVar166._20_4_;
        bVar15 = (bool)((byte)(uVar18 >> 6) & 1);
        auVar181._24_4_ = (uint)bVar15 * auVar178._24_4_ | (uint)!bVar15 * auVar166._24_4_;
        bVar15 = SUB81(uVar18 >> 7,0);
        auVar181._28_4_ = (uint)bVar15 * auVar178._28_4_ | (uint)!bVar15 * auVar166._28_4_;
        auVar166 = vfmadd231ps_avx512vl(auVar167,auVar181,auVar163);
        auVar165 = vfmsub231ps_avx512vl(auVar166,auVar154,auVar165);
        auVar165 = vsubps_avx512vl(auVar165,auVar180);
        auVar165 = vfmsub231ps_avx512vl(auVar165,auVar157,auVar181);
        auVar165 = vmulps_avx512vl(auVar165,auVar152);
        auVar166 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        bVar15 = (bool)((byte)uVar17 & 1);
        auVar182._0_4_ = (uint)bVar15 * auVar166._0_4_ | (uint)!bVar15 * auVar165._0_4_;
        bVar15 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar182._4_4_ = (uint)bVar15 * auVar166._4_4_ | (uint)!bVar15 * auVar165._4_4_;
        bVar15 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar182._8_4_ = (uint)bVar15 * auVar166._8_4_ | (uint)!bVar15 * auVar165._8_4_;
        bVar15 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar182._12_4_ = (uint)bVar15 * auVar166._12_4_ | (uint)!bVar15 * auVar165._12_4_;
        bVar15 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar182._16_4_ = (uint)bVar15 * auVar166._16_4_ | (uint)!bVar15 * auVar165._16_4_;
        bVar15 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar182._20_4_ = (uint)bVar15 * auVar166._20_4_ | (uint)!bVar15 * auVar165._20_4_;
        bVar15 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar182._24_4_ = (uint)bVar15 * auVar166._24_4_ | (uint)!bVar15 * auVar165._24_4_;
        bVar15 = SUB81(uVar17 >> 7,0);
        auVar182._28_4_ = (uint)bVar15 * auVar166._28_4_ | (uint)!bVar15 * auVar165._28_4_;
        auVar165 = vminps_avx512vl(auVar182,auVar147);
        auVar165 = vmaxps_avx(auVar165,auVar153);
        auVar166 = vfmadd213ps_avx512vl(auVar155,auVar165,auVar154);
        auVar167 = vrndscaleps_avx512vl(auVar166,1);
        uVar17 = vcmpps_avx512vl(auVar166,auVar167,1);
        auVar166 = vsubps_avx512vl(auVar167,auVar156);
        bVar15 = (bool)((byte)uVar17 & 1);
        auVar183._0_4_ = (uint)bVar15 * auVar166._0_4_ | (uint)!bVar15 * auVar167._0_4_;
        bVar15 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar183._4_4_ = (uint)bVar15 * auVar166._4_4_ | (uint)!bVar15 * auVar167._4_4_;
        bVar15 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar183._8_4_ = (uint)bVar15 * auVar166._8_4_ | (uint)!bVar15 * auVar167._8_4_;
        bVar15 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar183._12_4_ = (uint)bVar15 * auVar166._12_4_ | (uint)!bVar15 * auVar167._12_4_;
        bVar15 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar183._16_4_ = (uint)bVar15 * auVar166._16_4_ | (uint)!bVar15 * auVar167._16_4_;
        bVar15 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar183._20_4_ = (uint)bVar15 * auVar166._20_4_ | (uint)!bVar15 * auVar167._20_4_;
        bVar15 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar183._24_4_ = (uint)bVar15 * auVar166._24_4_ | (uint)!bVar15 * auVar167._24_4_;
        bVar15 = SUB81(uVar17 >> 7,0);
        auVar183._28_4_ = (uint)bVar15 * auVar166._28_4_ | (uint)!bVar15 * auVar167._28_4_;
        in_ZMM17 = ZEXT3264(auVar183);
        auVar165 = vfmsub231ps_avx512vl(auVar165,auVar183,auVar157);
        auVar165 = vfnmsub231ps_avx512vl(auVar165,auVar183,auVar163);
        auVar166 = vmulps_avx512vl(auVar165,auVar165);
        auVar167 = vfmadd213ps_avx512vl(auVar158,auVar165,auVar159);
        auVar167 = vfmadd213ps_avx512vl(auVar167,auVar165,auVar168);
        auVar167 = vfmadd213ps_avx512vl(auVar167,auVar165,auVar160);
        auVar167 = vfmadd213ps_avx512vl(auVar167,auVar165,auVar161);
        auVar167 = vfmadd213ps_avx512vl(auVar167,auVar165,auVar154);
        auVar165 = vfmadd213ps_avx512vl(auVar167,auVar166,auVar165);
        in_ZMM18 = ZEXT3264(auVar165);
        auVar165 = vaddps_avx512vl(auVar165,auVar156);
        auVar166 = vcvttps2dq_avx512vl(auVar183);
        auVar166 = vpslld_avx512vl(auVar166,0x17);
        in_ZMM16 = ZEXT3264(auVar166);
        auVar166 = vpaddd_avx512vl(auVar166,auVar162);
        auVar120 = vfmadd213ps_fma(auVar166,auVar165,auVar156);
        auVar165 = vrcpps_avx(ZEXT1632(auVar120));
        auVar120 = vfmsub213ps_fma(ZEXT1632(auVar120),auVar165,auVar156);
        auVar120 = vfnmadd132ps_fma(ZEXT1632(auVar120),auVar165,auVar165);
        auVar165 = vfnmadd213ps_avx512vl(ZEXT1632(auVar120),auVar152,auVar148);
        auVar146 = auVar165._0_28_;
        goto LAB_002a521e;
      case 6:
        uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var10);
        auVar167._4_4_ = uVar7;
        auVar167._0_4_ = uVar7;
        auVar167._8_4_ = uVar7;
        auVar167._12_4_ = uVar7;
        auVar167._16_4_ = uVar7;
        auVar167._20_4_ = uVar7;
        auVar167._24_4_ = uVar7;
        auVar167._28_4_ = uVar7;
        uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var10))[1];
        auVar166._4_4_ = uVar7;
        auVar166._0_4_ = uVar7;
        auVar166._8_4_ = uVar7;
        auVar166._12_4_ = uVar7;
        auVar166._16_4_ = uVar7;
        auVar166._20_4_ = uVar7;
        auVar166._24_4_ = uVar7;
        auVar166._28_4_ = uVar7;
        auVar166 = vfmadd213ps_avx512vl(auVar167,auVar164,auVar166);
        auVar165 = vmaxps_avx(auVar166,auVar165);
        auVar165 = vminps_avx(auVar165,auVar156);
        auVar146 = auVar165._0_28_;
LAB_002a521e:
        auVar164._4_4_ = auVar146._4_4_ * auVar164._4_4_;
        auVar164._0_4_ = auVar146._0_4_ * auVar164._0_4_;
        auVar164._8_4_ = auVar146._8_4_ * auVar164._8_4_;
        auVar164._12_4_ = auVar146._12_4_ * auVar164._12_4_;
        auVar164._16_4_ = auVar146._16_4_ * auVar164._16_4_;
        auVar164._20_4_ = auVar146._20_4_ * auVar164._20_4_;
        auVar164._24_4_ = auVar146._24_4_ * auVar164._24_4_;
      }
LAB_002a5222:
      *(undefined1 (*) [32])((long)top_blob->data + uVar101 * 0x20) = auVar164;
      uVar101 = uVar101 + 1;
    } while (uVar101 != uVar102);
  }
  else {
    if ((iVar106 != 0x10) || ((int)uVar100 < 1)) goto LAB_002a523f;
    auVar243 = vbroadcastss_avx512f(ZEXT416(0x80000000));
    auVar265 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q2,auVar243);
    auVar214 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q1,auVar243);
    auVar227 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
    auVar238 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar243);
    uVar101 = 0;
    auVar120 = vxorps_avx512vl(auVar120,auVar120);
    auVar252 = ZEXT1664(auVar120);
    auVar246 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    auVar249 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
    do {
      auVar120 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
      auVar264 = ZEXT1664(auVar120);
      if (lVar12 != 0) {
        auVar264 = *(undefined1 (*) [64])(lVar12 + uVar101 * 0x40);
      }
      pauVar109 = (undefined1 (*) [64])
                  ((long)(this->weight_data_tm).w * uVar101 * (this->weight_data_tm).elemsize +
                  (long)(this->weight_data_tm).data);
      auVar121 = in_ZMM18._0_16_;
      auVar126 = in_ZMM23._0_16_;
      auVar124 = in_ZMM21._0_16_;
      auVar125 = in_ZMM22._0_16_;
      auVar122 = in_ZMM19._0_16_;
      auVar123 = in_ZMM20._0_16_;
      auVar120 = in_ZMM17._0_16_;
      pauVar108 = local_f8;
      if ((int)uVar118 < 8) {
        auVar121 = vxorps_avx512vl(auVar121,auVar121);
        auVar267 = ZEXT1664(auVar121);
        auVar121 = vxorps_avx512vl(auVar126,auVar126);
        in_ZMM23 = ZEXT1664(auVar121);
        auVar121 = vxorps_avx512vl(auVar124,auVar124);
        auVar269 = ZEXT1664(auVar121);
        auVar121 = vxorps_avx512vl(auVar125,auVar125);
        in_ZMM22 = ZEXT1664(auVar121);
        auVar121 = vxorps_avx512vl(auVar122,auVar122);
        auVar268 = ZEXT1664(auVar121);
        auVar121 = vxorps_avx512vl(auVar123,auVar123);
        in_ZMM20 = ZEXT1664(auVar121);
        auVar120 = vxorps_avx512vl(auVar120,auVar120);
        auVar266 = ZEXT1664(auVar120);
        uVar100 = 0;
      }
      else {
        auVar120 = vxorps_avx512vl(auVar120,auVar120);
        auVar266 = ZEXT1664(auVar120);
        iVar97 = 7;
        auVar120 = vxorps_avx512vl(auVar123,auVar123);
        in_ZMM20 = ZEXT1664(auVar120);
        auVar120 = vxorps_avx512vl(auVar122,auVar122);
        auVar268 = ZEXT1664(auVar120);
        auVar120 = vxorps_avx512vl(auVar125,auVar125);
        in_ZMM22 = ZEXT1664(auVar120);
        auVar120 = vxorps_avx512vl(auVar124,auVar124);
        auVar269 = ZEXT1664(auVar120);
        auVar120 = vxorps_avx512vl(auVar126,auVar126);
        in_ZMM23 = ZEXT1664(auVar120);
        auVar120 = vxorps_avx512vl(auVar121,auVar121);
        auVar267 = ZEXT1664(auVar120);
        do {
          auVar185 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar108));
          auVar186 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar108 + 4)));
          auVar187 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar108 + 8)));
          auVar188 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar108 + 0xc)));
          auVar264 = vfmadd231ps_avx512f(auVar264,auVar185,*pauVar109);
          auVar266 = vfmadd231ps_avx512f(auVar266,auVar186,pauVar109[1]);
          in_ZMM20 = vfmadd231ps_avx512f(in_ZMM20,auVar187,pauVar109[2]);
          auVar268 = vfmadd231ps_avx512f(auVar268,auVar188,pauVar109[3]);
          auVar185 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar108 + 0x10)));
          auVar186 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar108 + 0x14)));
          auVar187 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar108 + 0x18)));
          auVar188 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar108 + 0x1c)));
          in_ZMM22 = vfmadd231ps_avx512f(in_ZMM22,auVar185,pauVar109[4]);
          auVar269 = vfmadd231ps_avx512f(auVar269,auVar186,pauVar109[5]);
          in_ZMM23 = vfmadd231ps_avx512f(in_ZMM23,auVar187,pauVar109[6]);
          auVar267 = vfmadd231ps_avx512f(auVar267,auVar188,pauVar109[7]);
          pauVar108 = pauVar108 + 1;
          pauVar109 = pauVar109 + 8;
          iVar97 = iVar97 + 8;
          uVar100 = uVar118 & 0xfffffff8;
        } while (iVar97 < (int)uVar118);
      }
      uVar114 = uVar100 | 3;
      while ((int)uVar114 < (int)uVar118) {
        auVar185 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar108));
        auVar186 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar108 + 4)));
        auVar187 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar108 + 8)));
        auVar188 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar108 + 0xc)));
        auVar264 = vfmadd231ps_avx512f(auVar264,auVar185,*pauVar109);
        auVar266 = vfmadd231ps_avx512f(auVar266,auVar186,pauVar109[1]);
        in_ZMM20 = vfmadd231ps_avx512f(in_ZMM20,auVar187,pauVar109[2]);
        auVar268 = vfmadd231ps_avx512f(auVar268,auVar188,pauVar109[3]);
        pauVar108 = (undefined1 (*) [32])(*pauVar108 + 0x10);
        pauVar109 = pauVar109 + 4;
        uVar114 = uVar100 + 7;
        uVar100 = uVar100 + 4;
      }
      if (uVar118 - uVar100 != 0 && (int)uVar100 <= (int)uVar118) {
        lVar112 = 0;
        do {
          auVar185 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar108 + lVar112 * 4)));
          auVar264 = vfmadd231ps_avx512f(auVar264,auVar185,*pauVar109);
          pauVar109 = pauVar109 + 1;
          lVar112 = lVar112 + 1;
        } while (uVar118 - uVar100 != (int)lVar112);
      }
      auVar267 = vaddps_avx512f(in_ZMM23,auVar267);
      in_ZMM21 = vaddps_avx512f(auVar269,in_ZMM22);
      in_ZMM18 = vaddps_avx512f(auVar267,in_ZMM21);
      in_ZMM19 = vaddps_avx512f(auVar268,in_ZMM20);
      auVar266 = vaddps_avx512f(in_ZMM19,auVar266);
      in_ZMM17 = vaddps_avx512f(in_ZMM18,auVar266);
      auVar264 = vaddps_avx512f(in_ZMM17,auVar264);
      in_ZMM16 = auVar264;
      switch(uVar9) {
      case 1:
        in_ZMM16 = vmaxps_avx512f(auVar264,auVar252);
        break;
      case 2:
        uVar17 = vcmpps_avx512f(auVar264,auVar252,1);
        uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var10);
        auVar187._4_4_ = uVar7;
        auVar187._0_4_ = uVar7;
        auVar187._8_4_ = uVar7;
        auVar187._12_4_ = uVar7;
        auVar187._16_4_ = uVar7;
        auVar187._20_4_ = uVar7;
        auVar187._24_4_ = uVar7;
        auVar187._28_4_ = uVar7;
        auVar187._32_4_ = uVar7;
        auVar187._36_4_ = uVar7;
        auVar187._40_4_ = uVar7;
        auVar187._44_4_ = uVar7;
        auVar187._48_4_ = uVar7;
        auVar187._52_4_ = uVar7;
        auVar187._56_4_ = uVar7;
        auVar187._60_4_ = uVar7;
        auVar266 = vmulps_avx512f(auVar264,auVar187);
        bVar15 = (bool)((byte)uVar17 & 1);
        in_ZMM16._0_4_ = (uint)bVar15 * auVar266._0_4_ | (uint)!bVar15 * auVar264._0_4_;
        bVar15 = (bool)((byte)(uVar17 >> 1) & 1);
        in_ZMM16._4_4_ = (uint)bVar15 * auVar266._4_4_ | (uint)!bVar15 * auVar264._4_4_;
        bVar15 = (bool)((byte)(uVar17 >> 2) & 1);
        in_ZMM16._8_4_ = (uint)bVar15 * auVar266._8_4_ | (uint)!bVar15 * auVar264._8_4_;
        bVar15 = (bool)((byte)(uVar17 >> 3) & 1);
        in_ZMM16._12_4_ = (uint)bVar15 * auVar266._12_4_ | (uint)!bVar15 * auVar264._12_4_;
        bVar15 = (bool)((byte)(uVar17 >> 4) & 1);
        in_ZMM16._16_4_ = (uint)bVar15 * auVar266._16_4_ | (uint)!bVar15 * auVar264._16_4_;
        bVar15 = (bool)((byte)(uVar17 >> 5) & 1);
        in_ZMM16._20_4_ = (uint)bVar15 * auVar266._20_4_ | (uint)!bVar15 * auVar264._20_4_;
        bVar15 = (bool)((byte)(uVar17 >> 6) & 1);
        in_ZMM16._24_4_ = (uint)bVar15 * auVar266._24_4_ | (uint)!bVar15 * auVar264._24_4_;
        bVar15 = (bool)((byte)(uVar17 >> 7) & 1);
        in_ZMM16._28_4_ = (uint)bVar15 * auVar266._28_4_ | (uint)!bVar15 * auVar264._28_4_;
        bVar15 = (bool)((byte)(uVar17 >> 8) & 1);
        in_ZMM16._32_4_ = (uint)bVar15 * auVar266._32_4_ | (uint)!bVar15 * auVar264._32_4_;
        bVar15 = (bool)((byte)(uVar17 >> 9) & 1);
        in_ZMM16._36_4_ = (uint)bVar15 * auVar266._36_4_ | (uint)!bVar15 * auVar264._36_4_;
        bVar15 = (bool)((byte)(uVar17 >> 10) & 1);
        in_ZMM16._40_4_ = (uint)bVar15 * auVar266._40_4_ | (uint)!bVar15 * auVar264._40_4_;
        bVar15 = (bool)((byte)(uVar17 >> 0xb) & 1);
        in_ZMM16._44_4_ = (uint)bVar15 * auVar266._44_4_ | (uint)!bVar15 * auVar264._44_4_;
        bVar15 = (bool)((byte)(uVar17 >> 0xc) & 1);
        in_ZMM16._48_4_ = (uint)bVar15 * auVar266._48_4_ | (uint)!bVar15 * auVar264._48_4_;
        bVar15 = (bool)((byte)(uVar17 >> 0xd) & 1);
        in_ZMM16._52_4_ = (uint)bVar15 * auVar266._52_4_ | (uint)!bVar15 * auVar264._52_4_;
        bVar15 = (bool)((byte)(uVar17 >> 0xe) & 1);
        in_ZMM16._56_4_ = (uint)bVar15 * auVar266._56_4_ | (uint)!bVar15 * auVar264._56_4_;
        bVar15 = SUB81(uVar17 >> 0xf,0);
        in_ZMM16._60_4_ = (uint)bVar15 * auVar266._60_4_ | (uint)!bVar15 * auVar264._60_4_;
        break;
      case 3:
        uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var10);
        auVar267._4_4_ = uVar7;
        auVar267._0_4_ = uVar7;
        auVar267._8_4_ = uVar7;
        auVar267._12_4_ = uVar7;
        auVar267._16_4_ = uVar7;
        auVar267._20_4_ = uVar7;
        auVar267._24_4_ = uVar7;
        auVar267._28_4_ = uVar7;
        auVar267._32_4_ = uVar7;
        auVar267._36_4_ = uVar7;
        auVar267._40_4_ = uVar7;
        auVar267._44_4_ = uVar7;
        auVar267._48_4_ = uVar7;
        auVar267._52_4_ = uVar7;
        auVar267._56_4_ = uVar7;
        auVar267._60_4_ = uVar7;
        auVar266 = vmaxps_avx512f(auVar264,auVar267);
        uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var10))[1];
        auVar264._4_4_ = uVar7;
        auVar264._0_4_ = uVar7;
        auVar264._8_4_ = uVar7;
        auVar264._12_4_ = uVar7;
        auVar264._16_4_ = uVar7;
        auVar264._20_4_ = uVar7;
        auVar264._24_4_ = uVar7;
        auVar264._28_4_ = uVar7;
        auVar264._32_4_ = uVar7;
        auVar264._36_4_ = uVar7;
        auVar264._40_4_ = uVar7;
        auVar264._44_4_ = uVar7;
        auVar264._48_4_ = uVar7;
        auVar264._52_4_ = uVar7;
        auVar264._56_4_ = uVar7;
        auVar264._60_4_ = uVar7;
        in_ZMM16 = vminps_avx512f(auVar266,auVar264);
        break;
      case 4:
        auVar264 = vxorps_avx512dq(auVar264,auVar243);
        auVar264 = vminps_avx512f(auVar264,(undefined1  [64])afVar86);
        auVar264 = vmaxps_avx512f(auVar264,(undefined1  [64])afVar87);
        auVar266 = vfmadd213ps_avx512f((undefined1  [64])afVar88,auVar264,(undefined1  [64])afVar94)
        ;
        auVar268 = vrndscaleps_avx512f(auVar266,1);
        uVar17 = vcmpps_avx512f(auVar266,auVar268,1);
        auVar266 = vsubps_avx512f(auVar268,(undefined1  [64])afVar85);
        bVar15 = (bool)((byte)uVar17 & 1);
        in_ZMM18._0_4_ = (uint)bVar15 * auVar266._0_4_ | (uint)!bVar15 * auVar268._0_4_;
        bVar15 = (bool)((byte)(uVar17 >> 1) & 1);
        in_ZMM18._4_4_ = (uint)bVar15 * auVar266._4_4_ | (uint)!bVar15 * auVar268._4_4_;
        bVar15 = (bool)((byte)(uVar17 >> 2) & 1);
        in_ZMM18._8_4_ = (uint)bVar15 * auVar266._8_4_ | (uint)!bVar15 * auVar268._8_4_;
        bVar15 = (bool)((byte)(uVar17 >> 3) & 1);
        in_ZMM18._12_4_ = (uint)bVar15 * auVar266._12_4_ | (uint)!bVar15 * auVar268._12_4_;
        bVar15 = (bool)((byte)(uVar17 >> 4) & 1);
        in_ZMM18._16_4_ = (uint)bVar15 * auVar266._16_4_ | (uint)!bVar15 * auVar268._16_4_;
        bVar15 = (bool)((byte)(uVar17 >> 5) & 1);
        in_ZMM18._20_4_ = (uint)bVar15 * auVar266._20_4_ | (uint)!bVar15 * auVar268._20_4_;
        bVar15 = (bool)((byte)(uVar17 >> 6) & 1);
        in_ZMM18._24_4_ = (uint)bVar15 * auVar266._24_4_ | (uint)!bVar15 * auVar268._24_4_;
        bVar15 = (bool)((byte)(uVar17 >> 7) & 1);
        in_ZMM18._28_4_ = (uint)bVar15 * auVar266._28_4_ | (uint)!bVar15 * auVar268._28_4_;
        bVar15 = (bool)((byte)(uVar17 >> 8) & 1);
        in_ZMM18._32_4_ = (uint)bVar15 * auVar266._32_4_ | (uint)!bVar15 * auVar268._32_4_;
        bVar15 = (bool)((byte)(uVar17 >> 9) & 1);
        in_ZMM18._36_4_ = (uint)bVar15 * auVar266._36_4_ | (uint)!bVar15 * auVar268._36_4_;
        bVar15 = (bool)((byte)(uVar17 >> 10) & 1);
        in_ZMM18._40_4_ = (uint)bVar15 * auVar266._40_4_ | (uint)!bVar15 * auVar268._40_4_;
        bVar15 = (bool)((byte)(uVar17 >> 0xb) & 1);
        in_ZMM18._44_4_ = (uint)bVar15 * auVar266._44_4_ | (uint)!bVar15 * auVar268._44_4_;
        bVar15 = (bool)((byte)(uVar17 >> 0xc) & 1);
        in_ZMM18._48_4_ = (uint)bVar15 * auVar266._48_4_ | (uint)!bVar15 * auVar268._48_4_;
        bVar15 = (bool)((byte)(uVar17 >> 0xd) & 1);
        in_ZMM18._52_4_ = (uint)bVar15 * auVar266._52_4_ | (uint)!bVar15 * auVar268._52_4_;
        bVar15 = (bool)((byte)(uVar17 >> 0xe) & 1);
        in_ZMM18._56_4_ = (uint)bVar15 * auVar266._56_4_ | (uint)!bVar15 * auVar268._56_4_;
        bVar15 = SUB81(uVar17 >> 0xf,0);
        in_ZMM18._60_4_ = (uint)bVar15 * auVar266._60_4_ | (uint)!bVar15 * auVar268._60_4_;
        auVar264 = vfmadd231ps_avx512f(auVar264,in_ZMM18,auVar265);
        auVar264 = vfmadd231ps_avx512f(auVar264,in_ZMM18,auVar214);
        auVar266 = vmulps_avx512f(auVar264,auVar264);
        auVar268 = vfmadd213ps_avx512f(auVar264,(undefined1  [64])afVar89,(undefined1  [64])afVar90)
        ;
        auVar268 = vfmadd213ps_avx512f(auVar268,auVar264,(undefined1  [64])afVar91);
        auVar268 = vfmadd213ps_avx512f(auVar268,auVar264,(undefined1  [64])afVar92);
        auVar268 = vfmadd213ps_avx512f(auVar268,auVar264,(undefined1  [64])afVar93);
        auVar268 = vfmadd213ps_avx512f(auVar268,auVar264,(undefined1  [64])afVar94);
        in_ZMM19 = vfmadd213ps_avx512f(auVar268,auVar266,auVar264);
        auVar264 = vaddps_avx512f(in_ZMM19,(undefined1  [64])afVar85);
        auVar266 = vcvttps2dq_avx512f(in_ZMM18);
        auVar266 = vpaddd_avx512f(auVar266,auVar227);
        auVar266 = vpslld_avx512f(auVar266,0x17);
        auVar264 = vfmadd213ps_avx512f(auVar266,auVar264,auVar246);
        in_ZMM17 = vrcp14ps_avx512f(auVar264);
        auVar264 = vfmsub213ps_avx512f(auVar264,in_ZMM17,auVar246);
        in_ZMM16 = vfnmadd132ps_avx512vl(auVar264,in_ZMM17,in_ZMM17);
        break;
      case 5:
        auVar266 = vminps_avx512f(auVar264,(undefined1  [64])afVar86);
        auVar266 = vmaxps_avx512f(auVar266,(undefined1  [64])afVar87);
        auVar268 = vfmadd213ps_avx512f((undefined1  [64])afVar88,auVar266,(undefined1  [64])afVar94)
        ;
        auVar269 = vrndscaleps_avx512f(auVar268,1);
        uVar17 = vcmpps_avx512f(auVar268,auVar269,1);
        auVar267 = vsubps_avx512f(auVar269,(undefined1  [64])afVar85);
        bVar15 = (bool)((byte)uVar17 & 1);
        auVar268._0_4_ = (uint)bVar15 * auVar267._0_4_ | (uint)!bVar15 * auVar269._0_4_;
        bVar15 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar268._4_4_ = (uint)bVar15 * auVar267._4_4_ | (uint)!bVar15 * auVar269._4_4_;
        bVar15 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar268._8_4_ = (uint)bVar15 * auVar267._8_4_ | (uint)!bVar15 * auVar269._8_4_;
        bVar15 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar268._12_4_ = (uint)bVar15 * auVar267._12_4_ | (uint)!bVar15 * auVar269._12_4_;
        bVar15 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar268._16_4_ = (uint)bVar15 * auVar267._16_4_ | (uint)!bVar15 * auVar269._16_4_;
        bVar15 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar268._20_4_ = (uint)bVar15 * auVar267._20_4_ | (uint)!bVar15 * auVar269._20_4_;
        bVar15 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar268._24_4_ = (uint)bVar15 * auVar267._24_4_ | (uint)!bVar15 * auVar269._24_4_;
        bVar15 = (bool)((byte)(uVar17 >> 7) & 1);
        auVar268._28_4_ = (uint)bVar15 * auVar267._28_4_ | (uint)!bVar15 * auVar269._28_4_;
        bVar15 = (bool)((byte)(uVar17 >> 8) & 1);
        auVar268._32_4_ = (uint)bVar15 * auVar267._32_4_ | (uint)!bVar15 * auVar269._32_4_;
        bVar15 = (bool)((byte)(uVar17 >> 9) & 1);
        auVar268._36_4_ = (uint)bVar15 * auVar267._36_4_ | (uint)!bVar15 * auVar269._36_4_;
        bVar15 = (bool)((byte)(uVar17 >> 10) & 1);
        auVar268._40_4_ = (uint)bVar15 * auVar267._40_4_ | (uint)!bVar15 * auVar269._40_4_;
        bVar15 = (bool)((byte)(uVar17 >> 0xb) & 1);
        auVar268._44_4_ = (uint)bVar15 * auVar267._44_4_ | (uint)!bVar15 * auVar269._44_4_;
        bVar15 = (bool)((byte)(uVar17 >> 0xc) & 1);
        auVar268._48_4_ = (uint)bVar15 * auVar267._48_4_ | (uint)!bVar15 * auVar269._48_4_;
        bVar15 = (bool)((byte)(uVar17 >> 0xd) & 1);
        auVar268._52_4_ = (uint)bVar15 * auVar267._52_4_ | (uint)!bVar15 * auVar269._52_4_;
        bVar15 = (bool)((byte)(uVar17 >> 0xe) & 1);
        auVar268._56_4_ = (uint)bVar15 * auVar267._56_4_ | (uint)!bVar15 * auVar269._56_4_;
        bVar15 = SUB81(uVar17 >> 0xf,0);
        auVar268._60_4_ = (uint)bVar15 * auVar267._60_4_ | (uint)!bVar15 * auVar269._60_4_;
        auVar266 = vfmadd231ps_avx512f(auVar266,auVar268,auVar265);
        auVar266 = vfmadd231ps_avx512f(auVar266,auVar268,auVar214);
        auVar269 = vmulps_avx512f(auVar266,auVar266);
        auVar267 = vfmadd213ps_avx512f(auVar266,(undefined1  [64])afVar89,(undefined1  [64])afVar90)
        ;
        auVar267 = vfmadd213ps_avx512f(auVar267,auVar266,(undefined1  [64])afVar91);
        auVar267 = vfmadd213ps_avx512f(auVar267,auVar266,(undefined1  [64])afVar92);
        auVar267 = vfmadd213ps_avx512f(auVar267,auVar266,(undefined1  [64])afVar93);
        auVar267 = vfmadd213ps_avx512f(auVar267,auVar266,(undefined1  [64])afVar94);
        auVar266 = vfmadd213ps_avx512f(auVar267,auVar269,auVar266);
        auVar266 = vaddps_avx512f(auVar266,(undefined1  [64])afVar85);
        auVar268 = vcvttps2dq_avx512f(auVar268);
        auVar268 = vpaddd_avx512f(auVar268,auVar227);
        auVar268 = vpslld_avx512f(auVar268,0x17);
        auVar266 = vfmadd213ps_avx512f(auVar268,auVar266,auVar246);
        auVar268 = vmaxps_avx512f(auVar266,(undefined1  [64])_ps512_min_norm_pos);
        auVar269 = vpsrld_avx512f(auVar268,0x17);
        auVar268 = vpternlogd_avx512f(auVar268,(undefined1  [64])afVar94,
                                      (undefined1  [64])_ps512_inv_mant_mask,0xec);
        uVar17 = vcmpps_avx512f(auVar268,(undefined1  [64])_ps512_cephes_SQRTHF,1);
        auVar267 = vsubps_avx512f(auVar268,(undefined1  [64])afVar85);
        auVar268 = vaddps_avx512f(auVar267,auVar268);
        bVar15 = (bool)((byte)uVar17 & 1);
        auVar185._0_4_ = (uint)bVar15 * auVar268._0_4_ | (uint)!bVar15 * auVar267._0_4_;
        bVar15 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar185._4_4_ = (uint)bVar15 * auVar268._4_4_ | (uint)!bVar15 * auVar267._4_4_;
        bVar15 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar185._8_4_ = (uint)bVar15 * auVar268._8_4_ | (uint)!bVar15 * auVar267._8_4_;
        bVar15 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar185._12_4_ = (uint)bVar15 * auVar268._12_4_ | (uint)!bVar15 * auVar267._12_4_;
        bVar15 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar185._16_4_ = (uint)bVar15 * auVar268._16_4_ | (uint)!bVar15 * auVar267._16_4_;
        bVar15 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar185._20_4_ = (uint)bVar15 * auVar268._20_4_ | (uint)!bVar15 * auVar267._20_4_;
        bVar15 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar185._24_4_ = (uint)bVar15 * auVar268._24_4_ | (uint)!bVar15 * auVar267._24_4_;
        bVar15 = (bool)((byte)(uVar17 >> 7) & 1);
        auVar185._28_4_ = (uint)bVar15 * auVar268._28_4_ | (uint)!bVar15 * auVar267._28_4_;
        bVar16 = (byte)(uVar17 >> 8);
        bVar15 = (bool)(bVar16 & 1);
        auVar185._32_4_ = (uint)bVar15 * auVar268._32_4_ | (uint)!bVar15 * auVar267._32_4_;
        bVar15 = (bool)((byte)(uVar17 >> 9) & 1);
        auVar185._36_4_ = (uint)bVar15 * auVar268._36_4_ | (uint)!bVar15 * auVar267._36_4_;
        bVar15 = (bool)((byte)(uVar17 >> 10) & 1);
        auVar185._40_4_ = (uint)bVar15 * auVar268._40_4_ | (uint)!bVar15 * auVar267._40_4_;
        bVar15 = (bool)((byte)(uVar17 >> 0xb) & 1);
        auVar185._44_4_ = (uint)bVar15 * auVar268._44_4_ | (uint)!bVar15 * auVar267._44_4_;
        bVar15 = (bool)((byte)(uVar17 >> 0xc) & 1);
        auVar185._48_4_ = (uint)bVar15 * auVar268._48_4_ | (uint)!bVar15 * auVar267._48_4_;
        bVar15 = (bool)((byte)(uVar17 >> 0xd) & 1);
        auVar185._52_4_ = (uint)bVar15 * auVar268._52_4_ | (uint)!bVar15 * auVar267._52_4_;
        bVar15 = (bool)((byte)(uVar17 >> 0xe) & 1);
        auVar185._56_4_ = (uint)bVar15 * auVar268._56_4_ | (uint)!bVar15 * auVar267._56_4_;
        bVar15 = SUB81(uVar17 >> 0xf,0);
        auVar185._60_4_ = (uint)bVar15 * auVar268._60_4_ | (uint)!bVar15 * auVar267._60_4_;
        auVar268 = vmulps_avx512f(auVar185,auVar185);
        auVar267 = vfmadd132ps_avx512f(auVar185,(undefined1  [64])_ps512_cephes_log_p1,
                                       (undefined1  [64])_ps512_cephes_log_p0);
        auVar267 = vfmadd213ps_avx512f(auVar267,auVar185,(undefined1  [64])_ps512_cephes_log_p2);
        auVar267 = vfmadd213ps_avx512f(auVar267,auVar185,(undefined1  [64])_ps512_cephes_log_p3);
        auVar267 = vfmadd213ps_avx512f(auVar267,auVar185,(undefined1  [64])_ps512_cephes_log_p4);
        auVar267 = vfmadd213ps_avx512f(auVar267,auVar185,(undefined1  [64])_ps512_cephes_log_p5);
        auVar267 = vfmadd213ps_avx512f(auVar267,auVar185,(undefined1  [64])_ps512_cephes_log_p6);
        auVar267 = vfmadd213ps_avx512f(auVar267,auVar185,(undefined1  [64])_ps512_cephes_log_p7);
        in_ZMM21 = vfmadd213ps_avx512f(auVar267,auVar185,(undefined1  [64])_ps512_cephes_log_p8);
        auVar267 = vmulps_avx512f(auVar268,auVar185);
        auVar267 = vfmadd213ps_avx512f(auVar267,in_ZMM21,auVar185);
        uVar18 = vcmpps_avx512f(auVar266,auVar252,2);
        auVar266 = vpsubd_avx512f(auVar269,auVar227);
        auVar266 = vcvtdq2ps_avx512f(auVar266);
        auVar269 = vaddps_avx512f(auVar266,(undefined1  [64])afVar85);
        bVar15 = (bool)((byte)uVar17 & 1);
        auVar186._0_4_ = (uint)bVar15 * auVar266._0_4_ | (uint)!bVar15 * auVar269._0_4_;
        bVar15 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar186._4_4_ = (uint)bVar15 * auVar266._4_4_ | (uint)!bVar15 * auVar269._4_4_;
        bVar15 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar186._8_4_ = (uint)bVar15 * auVar266._8_4_ | (uint)!bVar15 * auVar269._8_4_;
        bVar15 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar186._12_4_ = (uint)bVar15 * auVar266._12_4_ | (uint)!bVar15 * auVar269._12_4_;
        bVar15 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar186._16_4_ = (uint)bVar15 * auVar266._16_4_ | (uint)!bVar15 * auVar269._16_4_;
        bVar15 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar186._20_4_ = (uint)bVar15 * auVar266._20_4_ | (uint)!bVar15 * auVar269._20_4_;
        bVar15 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar186._24_4_ = (uint)bVar15 * auVar266._24_4_ | (uint)!bVar15 * auVar269._24_4_;
        bVar15 = (bool)((byte)(uVar17 >> 7) & 1);
        auVar186._28_4_ = (uint)bVar15 * auVar266._28_4_ | (uint)!bVar15 * auVar269._28_4_;
        bVar15 = (bool)(bVar16 & 1);
        auVar186._32_4_ = (uint)bVar15 * auVar266._32_4_ | (uint)!bVar15 * auVar269._32_4_;
        bVar15 = (bool)((byte)(uVar17 >> 9) & 1);
        auVar186._36_4_ = (uint)bVar15 * auVar266._36_4_ | (uint)!bVar15 * auVar269._36_4_;
        bVar15 = (bool)((byte)(uVar17 >> 10) & 1);
        auVar186._40_4_ = (uint)bVar15 * auVar266._40_4_ | (uint)!bVar15 * auVar269._40_4_;
        bVar15 = (bool)((byte)(uVar17 >> 0xb) & 1);
        auVar186._44_4_ = (uint)bVar15 * auVar266._44_4_ | (uint)!bVar15 * auVar269._44_4_;
        bVar15 = (bool)((byte)(uVar17 >> 0xc) & 1);
        auVar186._48_4_ = (uint)bVar15 * auVar266._48_4_ | (uint)!bVar15 * auVar269._48_4_;
        bVar15 = (bool)((byte)(uVar17 >> 0xd) & 1);
        auVar186._52_4_ = (uint)bVar15 * auVar266._52_4_ | (uint)!bVar15 * auVar269._52_4_;
        bVar15 = (bool)((byte)(uVar17 >> 0xe) & 1);
        auVar186._56_4_ = (uint)bVar15 * auVar266._56_4_ | (uint)!bVar15 * auVar269._56_4_;
        bVar15 = SUB81(uVar17 >> 0xf,0);
        auVar186._60_4_ = (uint)bVar15 * auVar266._60_4_ | (uint)!bVar15 * auVar269._60_4_;
        auVar266 = vfmadd231ps_avx512f(auVar267,auVar186,(undefined1  [64])afVar95);
        auVar266 = vfmadd231ps_avx512f(auVar266,auVar238,auVar268);
        in_ZMM22 = vfmadd231ps_avx512f(auVar266,(undefined1  [64])afVar96,auVar186);
        auVar266 = vmulps_avx512f(in_ZMM22,auVar249);
        auVar268 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        bVar15 = (bool)((byte)uVar18 & 1);
        auVar269._0_4_ = (uint)bVar15 * auVar268._0_4_ | (uint)!bVar15 * auVar266._0_4_;
        bVar15 = (bool)((byte)(uVar18 >> 1) & 1);
        auVar269._4_4_ = (uint)bVar15 * auVar268._4_4_ | (uint)!bVar15 * auVar266._4_4_;
        bVar15 = (bool)((byte)(uVar18 >> 2) & 1);
        auVar269._8_4_ = (uint)bVar15 * auVar268._8_4_ | (uint)!bVar15 * auVar266._8_4_;
        bVar15 = (bool)((byte)(uVar18 >> 3) & 1);
        auVar269._12_4_ = (uint)bVar15 * auVar268._12_4_ | (uint)!bVar15 * auVar266._12_4_;
        bVar15 = (bool)((byte)(uVar18 >> 4) & 1);
        auVar269._16_4_ = (uint)bVar15 * auVar268._16_4_ | (uint)!bVar15 * auVar266._16_4_;
        bVar15 = (bool)((byte)(uVar18 >> 5) & 1);
        auVar269._20_4_ = (uint)bVar15 * auVar268._20_4_ | (uint)!bVar15 * auVar266._20_4_;
        bVar15 = (bool)((byte)(uVar18 >> 6) & 1);
        auVar269._24_4_ = (uint)bVar15 * auVar268._24_4_ | (uint)!bVar15 * auVar266._24_4_;
        bVar15 = (bool)((byte)(uVar18 >> 7) & 1);
        auVar269._28_4_ = (uint)bVar15 * auVar268._28_4_ | (uint)!bVar15 * auVar266._28_4_;
        bVar15 = (bool)((byte)(uVar18 >> 8) & 1);
        auVar269._32_4_ = (uint)bVar15 * auVar268._32_4_ | (uint)!bVar15 * auVar266._32_4_;
        bVar15 = (bool)((byte)(uVar18 >> 9) & 1);
        auVar269._36_4_ = (uint)bVar15 * auVar268._36_4_ | (uint)!bVar15 * auVar266._36_4_;
        bVar15 = (bool)((byte)(uVar18 >> 10) & 1);
        auVar269._40_4_ = (uint)bVar15 * auVar268._40_4_ | (uint)!bVar15 * auVar266._40_4_;
        bVar15 = (bool)((byte)(uVar18 >> 0xb) & 1);
        auVar269._44_4_ = (uint)bVar15 * auVar268._44_4_ | (uint)!bVar15 * auVar266._44_4_;
        bVar15 = (bool)((byte)(uVar18 >> 0xc) & 1);
        auVar269._48_4_ = (uint)bVar15 * auVar268._48_4_ | (uint)!bVar15 * auVar266._48_4_;
        bVar15 = (bool)((byte)(uVar18 >> 0xd) & 1);
        auVar269._52_4_ = (uint)bVar15 * auVar268._52_4_ | (uint)!bVar15 * auVar266._52_4_;
        bVar15 = (bool)((byte)(uVar18 >> 0xe) & 1);
        auVar269._56_4_ = (uint)bVar15 * auVar268._56_4_ | (uint)!bVar15 * auVar266._56_4_;
        bVar15 = SUB81(uVar18 >> 0xf,0);
        auVar269._60_4_ = (uint)bVar15 * auVar268._60_4_ | (uint)!bVar15 * auVar266._60_4_;
        auVar266 = vminps_avx512f(auVar269,(undefined1  [64])afVar86);
        auVar266 = vmaxps_avx512f(auVar266,(undefined1  [64])afVar87);
        auVar268 = vfmadd213ps_avx512f((undefined1  [64])afVar88,auVar266,(undefined1  [64])afVar94)
        ;
        auVar269 = vrndscaleps_avx512f(auVar268,1);
        uVar17 = vcmpps_avx512f(auVar268,auVar269,1);
        auVar268 = vsubps_avx512f(auVar269,(undefined1  [64])afVar85);
        bVar15 = (bool)((byte)uVar17 & 1);
        in_ZMM19._0_4_ = (uint)bVar15 * auVar268._0_4_ | (uint)!bVar15 * auVar269._0_4_;
        bVar15 = (bool)((byte)(uVar17 >> 1) & 1);
        in_ZMM19._4_4_ = (uint)bVar15 * auVar268._4_4_ | (uint)!bVar15 * auVar269._4_4_;
        bVar15 = (bool)((byte)(uVar17 >> 2) & 1);
        in_ZMM19._8_4_ = (uint)bVar15 * auVar268._8_4_ | (uint)!bVar15 * auVar269._8_4_;
        bVar15 = (bool)((byte)(uVar17 >> 3) & 1);
        in_ZMM19._12_4_ = (uint)bVar15 * auVar268._12_4_ | (uint)!bVar15 * auVar269._12_4_;
        bVar15 = (bool)((byte)(uVar17 >> 4) & 1);
        in_ZMM19._16_4_ = (uint)bVar15 * auVar268._16_4_ | (uint)!bVar15 * auVar269._16_4_;
        bVar15 = (bool)((byte)(uVar17 >> 5) & 1);
        in_ZMM19._20_4_ = (uint)bVar15 * auVar268._20_4_ | (uint)!bVar15 * auVar269._20_4_;
        bVar15 = (bool)((byte)(uVar17 >> 6) & 1);
        in_ZMM19._24_4_ = (uint)bVar15 * auVar268._24_4_ | (uint)!bVar15 * auVar269._24_4_;
        bVar15 = (bool)((byte)(uVar17 >> 7) & 1);
        in_ZMM19._28_4_ = (uint)bVar15 * auVar268._28_4_ | (uint)!bVar15 * auVar269._28_4_;
        bVar15 = (bool)((byte)(uVar17 >> 8) & 1);
        in_ZMM19._32_4_ = (uint)bVar15 * auVar268._32_4_ | (uint)!bVar15 * auVar269._32_4_;
        bVar15 = (bool)((byte)(uVar17 >> 9) & 1);
        in_ZMM19._36_4_ = (uint)bVar15 * auVar268._36_4_ | (uint)!bVar15 * auVar269._36_4_;
        bVar15 = (bool)((byte)(uVar17 >> 10) & 1);
        in_ZMM19._40_4_ = (uint)bVar15 * auVar268._40_4_ | (uint)!bVar15 * auVar269._40_4_;
        bVar15 = (bool)((byte)(uVar17 >> 0xb) & 1);
        in_ZMM19._44_4_ = (uint)bVar15 * auVar268._44_4_ | (uint)!bVar15 * auVar269._44_4_;
        bVar15 = (bool)((byte)(uVar17 >> 0xc) & 1);
        in_ZMM19._48_4_ = (uint)bVar15 * auVar268._48_4_ | (uint)!bVar15 * auVar269._48_4_;
        bVar15 = (bool)((byte)(uVar17 >> 0xd) & 1);
        in_ZMM19._52_4_ = (uint)bVar15 * auVar268._52_4_ | (uint)!bVar15 * auVar269._52_4_;
        bVar15 = (bool)((byte)(uVar17 >> 0xe) & 1);
        in_ZMM19._56_4_ = (uint)bVar15 * auVar268._56_4_ | (uint)!bVar15 * auVar269._56_4_;
        bVar15 = SUB81(uVar17 >> 0xf,0);
        in_ZMM19._60_4_ = (uint)bVar15 * auVar268._60_4_ | (uint)!bVar15 * auVar269._60_4_;
        auVar266 = vfmadd231ps_avx512f(auVar266,in_ZMM19,auVar265);
        auVar266 = vfmadd231ps_avx512f(auVar266,in_ZMM19,auVar214);
        auVar268 = vmulps_avx512f(auVar266,auVar266);
        auVar269 = vfmadd213ps_avx512f(auVar266,(undefined1  [64])afVar89,(undefined1  [64])afVar90)
        ;
        auVar269 = vfmadd213ps_avx512f(auVar269,auVar266,(undefined1  [64])afVar91);
        auVar269 = vfmadd213ps_avx512f(auVar269,auVar266,(undefined1  [64])afVar92);
        auVar269 = vfmadd213ps_avx512f(auVar269,auVar266,(undefined1  [64])afVar93);
        auVar269 = vfmadd213ps_avx512f(auVar269,auVar266,(undefined1  [64])afVar94);
        in_ZMM20 = vfmadd213ps_avx512f(auVar269,auVar268,auVar266);
        auVar266 = vaddps_avx512f(in_ZMM20,(undefined1  [64])afVar85);
        auVar268 = vcvttps2dq_avx512f(in_ZMM19);
        auVar268 = vpaddd_avx512f(auVar268,auVar227);
        auVar268 = vpslld_avx512f(auVar268,0x17);
        auVar266 = vfmadd213ps_avx512f(auVar268,auVar266,auVar246);
        in_ZMM17 = vrcp14ps_avx512f(auVar266);
        auVar266 = vfmsub213ps_avx512f(auVar266,in_ZMM17,auVar246);
        auVar266 = vfnmadd132ps_avx512vl(auVar266,in_ZMM17,in_ZMM17);
        in_ZMM18 = vfnmsub213ps_avx512f(auVar266,auVar249,auVar246);
        in_ZMM16 = vmulps_avx512f(in_ZMM18,auVar264);
        break;
      case 6:
        auVar268 = vbroadcastss_avx512f(ZEXT416(**(uint **)(&this->field_0xe8 + (long)p_Var10)));
        uVar100 = (*(uint **)(&this->field_0xe8 + (long)p_Var10))[1];
        auVar266._4_4_ = uVar100;
        auVar266._0_4_ = uVar100;
        auVar266._8_4_ = uVar100;
        auVar266._12_4_ = uVar100;
        auVar266._16_4_ = uVar100;
        auVar266._20_4_ = uVar100;
        auVar266._24_4_ = uVar100;
        auVar266._28_4_ = uVar100;
        auVar266._32_4_ = uVar100;
        auVar266._36_4_ = uVar100;
        auVar266._40_4_ = uVar100;
        auVar266._44_4_ = uVar100;
        auVar266._48_4_ = uVar100;
        auVar266._52_4_ = uVar100;
        auVar266._56_4_ = uVar100;
        auVar266._60_4_ = uVar100;
        auVar266 = vfmadd213ps_avx512f(auVar268,auVar264,auVar266);
        auVar266 = vmaxps_avx512f(auVar266,auVar252);
        in_ZMM17 = vminps_avx512f(auVar266,auVar246);
        in_ZMM16 = vmulps_avx512f(in_ZMM17,auVar264);
      }
      *(undefined1 (*) [64])((long)top_blob->data + uVar101 * 0x40) = in_ZMM16;
      uVar101 = uVar101 + 1;
    } while (uVar101 != uVar102);
  }
  iVar97 = 0;
LAB_002a523f:
  if (piStack_f0 != (int *)0x0) {
    LOCK();
    *piStack_f0 = *piStack_f0 + -1;
    UNLOCK();
    if (*piStack_f0 == 0) {
      if (local_d8 == (Allocator *)0x0) {
        if (local_f8 != (undefined1 (*) [32])0x0) {
          free(local_f8);
        }
      }
      else {
        (*local_d8->_vptr_Allocator[3])();
      }
    }
  }
  return iVar97;
}

Assistant:

int InnerProduct_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return forward_fp16s(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}